

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_man.cpp
# Opt level: O1

bool __thiscall FScanner::ScanString(FScanner *this,bool tokens)

{
  FString *this_00;
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  char *pcVar6;
  BYTE BVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  byte *pbVar11;
  byte *pbVar12;
  byte *pbVar13;
  bool bVar14;
  bool bVar15;
  FString FStack_38;
  
  if (this->ScriptOpen == false) {
    I_FatalError("SC_ call before SC_Open().");
  }
  if (this->AlreadyGot == true) {
    this->AlreadyGot = false;
    if (!tokens) {
      return true;
    }
    if (this->LastGotToken != false) {
      return true;
    }
    this->ScriptPtr = this->LastGotPtr;
    this->Line = this->LastGotLine;
  }
  this->Crossed = false;
  pbVar13 = (byte *)this->ScriptPtr;
  pbVar1 = (byte *)this->ScriptEndPtr;
  if (pbVar13 < pbVar1) {
    this->LastGotPtr = (char *)pbVar13;
    this->LastGotLine = this->Line;
LAB_004821e1:
    pbVar5 = pbVar13;
    pbVar13 = pbVar5;
LAB_004821f1:
    if (!tokens) {
LAB_00482208:
      if ((this->CMode & 1U) != 0) {
        bVar2 = *pbVar13;
        if (0x39 < bVar2) {
          if (bVar2 < 0x5b) {
            if (bVar2 < 0x3d) {
              if (bVar2 == 0x3a) {
                bVar15 = pbVar13[1] == 0x3a;
              }
              else {
                if (bVar2 != 0x3c) goto LAB_00482479;
                bVar15 = pbVar13[1] == 0x3c;
              }
            }
            else if (bVar2 == 0x3d) {
              bVar15 = pbVar13[1] == 0x3d;
            }
            else {
              if (0x3e < bVar2) {
                if (0x40 < bVar2) goto LAB_004827d0;
                goto LAB_00482479;
              }
              bVar15 = pbVar13[1] == 0x3e;
            }
LAB_004823b1:
            pbVar4 = pbVar13 + 1;
            if (bVar15) {
              pbVar4 = pbVar13 + 2;
            }
            uVar10 = 0x13;
            goto LAB_00482484;
          }
          if (bVar2 < 0x7b) {
            if (bVar2 != 0x5f && bVar2 < 0x61) goto LAB_00482479;
          }
          else {
            if (bVar2 == 0x7c) {
              bVar15 = pbVar13[1] == 0x7c;
              goto LAB_004823b1;
            }
            if (bVar2 < 0x7f) goto LAB_00482479;
          }
          goto LAB_004827d0;
        }
        if (bVar2 < 0x26) {
          if (bVar2 < 0x21) {
            if (bVar2 == 10) {
              uVar10 = 0x15;
              pbVar4 = pbVar13 + 1;
            }
            else {
              do {
                pbVar11 = pbVar13 + 1;
                pbVar13 = pbVar13 + 1;
                uVar10 = 2;
                pbVar4 = pbVar13;
                if (*pbVar11 == 10) break;
              } while (*pbVar11 < 0x21);
            }
          }
          else if (bVar2 == 0x21) {
LAB_00482479:
            pbVar13 = pbVar13 + 1;
LAB_0048247c:
            uVar10 = 0x13;
            pbVar4 = pbVar13;
          }
          else if (bVar2 < 0x23) {
            uVar10 = 0x2bd;
            pbVar4 = pbVar13 + 1;
          }
          else {
            if (bVar2 != 0x23) goto LAB_00482479;
            pbVar4 = pbVar13 + 1;
            bVar2 = pbVar13[1];
            uVar10 = 0x13;
            if (bVar2 == 0x65) {
              if ((pbVar13[2] != 0x6e) || (pbVar13[3] != 100)) goto LAB_00482484;
              lVar9 = 4;
              bVar2 = pbVar13[4];
            }
            else {
              lVar9 = 1;
            }
            if (((((bVar2 == 0x72) && (pbVar13[lVar9 + 1] == 0x65)) && (pbVar13[lVar9 + 2] == 0x67))
                && ((pbVar13[lVar9 + 3] == 0x69 && (pbVar13[lVar9 + 4] == 0x6f)))) &&
               (pbVar13[lVar9 + 5] == 0x6e)) {
              pbVar13 = pbVar13 + lVar9 + 6;
              do {
                pbVar4 = pbVar13 + 1;
                bVar2 = *pbVar13;
                uVar10 = 0x15;
                pbVar13 = pbVar4;
              } while (bVar2 != 10);
            }
          }
        }
        else {
          if (bVar2 < 0x2d) {
            if (bVar2 == 0x26) {
              bVar15 = pbVar13[1] == 0x26;
              goto LAB_004823b1;
            }
            if (bVar2 < 0x28) goto LAB_004827d0;
            goto LAB_00482479;
          }
          if (bVar2 == 0x2d) {
            uVar10 = 0x2e4;
            pbVar4 = pbVar13 + 1;
          }
          else if (bVar2 < 0x2f) {
            pbVar11 = pbVar13 + 1;
            pbVar13 = pbVar13 + 1;
            uVar10 = 0x13;
            pbVar4 = pbVar13;
            if ((byte)(*pbVar11 - 0x30) < 10) {
LAB_0048235c:
              pbVar13 = pbVar13 + 2;
              do {
                pbVar12 = pbVar13;
                bVar2 = pbVar12[-1];
                if (0x45 < bVar2) {
                  pbVar4 = pbVar12 + -1;
                  if (bVar2 < 0x65) goto joined_r0x0048252e;
                  if (bVar2 == 0x65) goto LAB_004825e0;
                  uVar10 = 0x13;
                  if (0x66 < bVar2) goto LAB_00482484;
                  goto LAB_004826c8;
                }
                if (bVar2 < 0x30) goto LAB_0048238b;
                pbVar13 = pbVar12 + 1;
              } while (bVar2 < 0x3a);
              if (bVar2 == 0x45) {
LAB_004825e0:
                bVar2 = *pbVar12;
                pbVar11 = pbVar12 + -1;
                pbVar4 = pbVar11;
                if (bVar2 < 0x2d) {
                  uVar10 = 0x13;
                  if (bVar2 == 0x2b) {
LAB_0048267b:
                    uVar10 = 0x13;
                    pbVar4 = pbVar11;
                    if ((byte)(pbVar12[1] - 0x30) < 10) {
                      pbVar12 = pbVar12 + 1;
LAB_0048269b:
                      pbVar12 = pbVar12 + 1;
                      bVar2 = *pbVar12;
                      pbVar4 = pbVar12;
                      if (bVar2 < 0x46) goto code_r0x004826a5;
                      bVar2 = bVar2 & 0xdf;
joined_r0x0048252e:
                      uVar10 = 0x13;
                      if (bVar2 == 0x46) {
LAB_004826c8:
                        uVar10 = 0x13;
                        pbVar4 = pbVar4 + 1;
                      }
                    }
                  }
                }
                else {
                  if (bVar2 == 0x2d) goto LAB_0048267b;
                  uVar10 = 0x13;
                  if ((byte)(bVar2 - 0x30) < 10) goto LAB_0048269b;
                }
              }
              else {
LAB_0048238b:
                uVar10 = 0x13;
                pbVar4 = pbVar12 + -1;
              }
            }
          }
          else {
            if (bVar2 != 0x2f) {
              pbVar13 = pbVar13 + 2;
              do {
                pbVar11 = pbVar13;
                bVar2 = pbVar11[-1];
                if (0x45 < bVar2) {
                  pbVar13 = pbVar11 + -1;
                  if (bVar2 < 0x61) {
                    uVar10 = 0x13;
                    pbVar4 = pbVar13;
                    if (bVar2 != 0x5f && 0x5a < bVar2) goto LAB_00482484;
                    goto LAB_004827d0;
                  }
                  if (0x65 < bVar2) goto joined_r0x00482667;
                  if (bVar2 != 0x65) goto LAB_004827d0;
LAB_0048262f:
                  bVar2 = *pbVar11;
                  pbVar13 = pbVar11;
                  pbVar12 = pbVar11;
                  if (bVar2 < 0x2d) {
                    if (bVar2 != 0x2b) goto LAB_004827d7;
                    goto LAB_0048267b;
                  }
                  if (bVar2 == 0x2d) goto LAB_0048267b;
                  if (9 < (byte)(bVar2 - 0x30)) goto LAB_004827d7;
                  pbVar13 = pbVar11 + 2;
                  goto LAB_004826dd;
                }
                if (bVar2 < 0x2f) {
                  pbVar13 = pbVar11 + -1;
                  if (bVar2 == 0x27) goto LAB_004827d0;
                  if (bVar2 == 0x2e) goto LAB_0048235c;
                  goto LAB_0048247c;
                }
                if (0x39 < bVar2) {
                  pbVar13 = pbVar11 + -1;
                  uVar10 = 0x13;
                  pbVar4 = pbVar13;
                  if (bVar2 < 0x41) goto LAB_00482484;
                  if (bVar2 == 0x45) goto LAB_0048262f;
                  goto LAB_004827d0;
                }
                pbVar13 = pbVar11 + 1;
              } while (bVar2 != 0x2f);
              pbVar13 = pbVar11 + -1;
              goto LAB_0048247c;
            }
            if (pbVar13[1] == 0x2a) {
              uVar10 = 0x2d;
              pbVar4 = pbVar13 + 2;
            }
            else {
              if (pbVar13[1] != 0x2f) goto LAB_00482479;
              pbVar13 = pbVar13 + 2;
              do {
                pbVar4 = pbVar13 + 1;
                bVar2 = *pbVar13;
                uVar10 = 0x15;
                pbVar13 = pbVar4;
              } while (bVar2 != 10);
            }
          }
        }
        goto LAB_00482484;
      }
      bVar2 = *pbVar5;
      pbVar4 = pbVar5;
      if (0x2e < bVar2) {
        if (0x3c < bVar2) {
          if ((2 < bVar2 - 0x7b) && (bVar2 != 0x3d)) goto LAB_00487f77;
          pbVar13 = pbVar5 + 1;
          uVar10 = 0x13;
          goto LAB_004829bf;
        }
        if (bVar2 == 0x2f) {
          pbVar13 = pbVar5 + 1;
          bVar2 = pbVar5[1];
          pbVar4 = pbVar13;
          if (0x2f < bVar2) {
            uVar10 = 0x13;
            if (bVar2 < 0x3d) goto LAB_00487ffc;
            if (2 < bVar2 - 0x7b) goto LAB_0048802d;
            goto LAB_004829bf;
          }
          if (bVar2 < 0x23) goto joined_r0x00487fd4;
          if (bVar2 == 0x2a) {
            pbVar13 = pbVar5 + 2;
            uVar10 = 0x2d;
            goto LAB_004829bf;
          }
          if (bVar2 != 0x2f) goto LAB_00487f77;
        }
        else {
          pbVar13 = pbVar5;
          if (bVar2 != 0x3b) goto LAB_00487f77;
        }
        pbVar13 = pbVar13 + 1;
        do {
          bVar2 = *pbVar13;
          pbVar13 = pbVar13 + 1;
        } while (bVar2 != 10);
LAB_0048292f:
        uVar10 = 0x15;
        goto LAB_004829bf;
      }
      if (bVar2 < 0x21) {
        pbVar13 = pbVar5;
        if (bVar2 != 10) goto LAB_0048288b;
        pbVar13 = pbVar5 + 1;
        goto LAB_0048292f;
      }
      if (bVar2 == 0x21) goto LAB_00487f77;
      if (bVar2 < 0x23) {
        pbVar13 = pbVar5 + 1;
        uVar10 = 0x2bd;
        goto LAB_004829bf;
      }
      if (bVar2 != 0x23) goto LAB_00487f77;
      bVar2 = pbVar5[1];
      if (bVar2 == 0x65) {
        bVar2 = pbVar5[2];
        if (bVar2 != 0x6e) {
          pbVar13 = pbVar5 + 2;
          goto LAB_00487f80;
        }
        bVar2 = pbVar5[3];
        if (bVar2 != 100) {
          pbVar13 = pbVar5 + 3;
          goto LAB_00487f80;
        }
        bVar2 = pbVar5[4];
        lVar9 = 4;
        if (bVar2 != 0x72) {
          pbVar13 = pbVar5 + 4;
          goto LAB_00487f80;
        }
      }
      else {
        lVar9 = 1;
        if (bVar2 != 0x72) {
          pbVar13 = pbVar5 + 1;
          goto LAB_00487f80;
        }
      }
      bVar2 = pbVar5[lVar9 + 1];
      if (bVar2 != 0x65) {
        pbVar13 = pbVar5 + lVar9 + 1;
        goto LAB_00487f80;
      }
      bVar2 = pbVar5[lVar9 + 2];
      if (bVar2 != 0x67) {
        pbVar13 = pbVar5 + lVar9 + 2;
        goto LAB_00487f80;
      }
      bVar2 = pbVar5[lVar9 + 3];
      if (bVar2 != 0x69) {
        pbVar13 = pbVar5 + lVar9 + 3;
        goto LAB_00487f80;
      }
      bVar2 = pbVar5[lVar9 + 4];
      if (bVar2 != 0x6f) {
        pbVar13 = pbVar5 + lVar9 + 4;
        goto LAB_00487f80;
      }
      bVar2 = pbVar5[lVar9 + 5];
      pbVar13 = pbVar5 + lVar9 + 5;
      if (bVar2 == 0x6e) goto LAB_00482c31;
      goto LAB_00487f80;
    }
    if (this->StateMode != '\0') {
      bVar2 = *pbVar13;
      pbVar4 = pbVar13;
      if (0x4c < bVar2) {
        if (bVar2 < 0x6c) {
          if (bVar2 < 0x58) {
            if (bVar2 != 0x53) {
              if (bVar2 != 0x57) goto LAB_00487e3e;
              goto LAB_00482d29;
            }
LAB_00482a31:
            bVar2 = pbVar13[1];
            if ((bVar2 & 0xdf) != 0x54) goto LAB_00483067;
            bVar2 = pbVar13[2];
            if ((bVar2 & 0xdf) == 0x4f) {
              bVar2 = pbVar13[3];
              if ((bVar2 & 0xdf) != 0x50) goto LAB_0048351f;
              bVar2 = pbVar13[4];
              pbVar13 = pbVar13 + 4;
              if (0x39 < bVar2) {
                uVar10 = 5;
                if (0x3b < bVar2 && bVar2 != 0x7d) goto LAB_00487e49;
                goto LAB_00487f56;
              }
              uVar10 = 5;
              if (0x22 < bVar2 || bVar2 == 0x21) goto LAB_00487e49;
              goto LAB_00487f56;
            }
          }
          else {
            if (bVar2 < 0x66) goto LAB_00487e3e;
            if (bVar2 != 0x66) {
              if (0x67 < bVar2) goto LAB_00487e3e;
              goto LAB_00482ea0;
            }
LAB_00482b2f:
            bVar2 = pbVar13[1];
            if ((bVar2 & 0xdf) != 0x41) {
LAB_00483067:
              uVar10 = 0;
              pbVar13 = pbVar13 + 1;
              goto LAB_00487e49;
            }
            bVar2 = pbVar13[2];
            if ((bVar2 & 0xdf) == 0x49) {
              bVar2 = pbVar13[3];
              if ((bVar2 & 0xdf) != 0x4c) goto LAB_0048351f;
              bVar2 = pbVar13[4];
              pbVar13 = pbVar13 + 4;
              if (0x39 < bVar2) {
                uVar10 = 2;
                if (0x3b < bVar2 && bVar2 != 0x7d) goto LAB_00487e49;
                goto LAB_00487f4a;
              }
              uVar10 = 2;
              if (0x22 < bVar2 || bVar2 == 0x21) goto LAB_00487e49;
              goto LAB_00487f4a;
            }
          }
LAB_00483516:
          uVar10 = 0;
          pbVar13 = pbVar13 + 2;
        }
        else {
          if (bVar2 < 0x77) {
            if (bVar2 != 0x6c) {
              if (bVar2 != 0x73) goto LAB_00487e3e;
              goto LAB_00482a31;
            }
LAB_00483000:
            bVar2 = pbVar13[1];
            if ((bVar2 & 0xdf) != 0x4f) goto LAB_00483067;
            bVar2 = pbVar13[2];
            if ((bVar2 & 0xdf) != 0x4f) goto LAB_00483516;
            bVar2 = pbVar13[3];
            if ((bVar2 & 0xdf) == 0x50) {
              bVar2 = pbVar13[4];
              pbVar13 = pbVar13 + 4;
              if (0x39 < bVar2) {
                uVar10 = 4;
                if (0x3b < bVar2 && bVar2 != 0x7d) goto LAB_00487e49;
                goto LAB_00487f2d;
              }
              uVar10 = 4;
              if (0x22 < bVar2 || bVar2 == 0x21) goto LAB_00487e49;
              goto LAB_00487f2d;
            }
          }
          else {
            if (bVar2 != 0x77) {
              if (bVar2 != 0x7d) goto LAB_00487e3e;
              pbVar13 = pbVar13 + 1;
              this->StateMode = '\0';
              this->StateOptions = false;
              this->TokenType = 0x7d;
              goto LAB_00487e9a;
            }
LAB_00482d29:
            bVar2 = pbVar13[1];
            if ((bVar2 & 0xdf) != 0x41) goto LAB_00483067;
            bVar2 = pbVar13[2];
            if ((bVar2 & 0xdf) != 0x49) goto LAB_00483516;
            bVar2 = pbVar13[3];
            if ((bVar2 & 0xdf) == 0x54) {
              bVar2 = pbVar13[4];
              pbVar13 = pbVar13 + 4;
              if (0x39 < bVar2) {
                uVar10 = 6;
                if (0x3b < bVar2 && bVar2 != 0x7d) goto LAB_00487e49;
                goto LAB_00487f39;
              }
              uVar10 = 6;
              if (0x22 < bVar2 || bVar2 == 0x21) goto LAB_00487e49;
              goto LAB_00487f39;
            }
          }
LAB_0048351f:
          uVar10 = 0;
          pbVar13 = pbVar13 + 3;
        }
        goto LAB_00487e49;
      }
      if (0x2f < bVar2) {
        if (bVar2 < 0x46) {
          if (bVar2 < 0x3a) goto LAB_00487e3e;
          if (bVar2 == 0x3a) {
            pbVar13 = pbVar13 + 1;
            this->TokenType = 0x3a;
          }
          else {
            if (0x3b < bVar2) goto LAB_00487e3e;
            pbVar13 = pbVar13 + 1;
            this->TokenType = 0x3b;
          }
          goto LAB_00487e9a;
        }
        if (bVar2 == 0x46) goto LAB_00482b2f;
        if (0x47 < bVar2) {
          if (bVar2 != 0x4c) goto LAB_00487e3e;
          goto LAB_00483000;
        }
LAB_00482ea0:
        bVar2 = pbVar13[1];
        if ((bVar2 & 0xdf) != 0x4f) goto LAB_00483067;
        bVar2 = pbVar13[2];
        if ((bVar2 & 0xdf) != 0x54) goto LAB_00483516;
        bVar2 = pbVar13[3];
        if ((bVar2 & 0xdf) != 0x4f) goto LAB_0048351f;
        bVar2 = pbVar13[4];
        pbVar13 = pbVar13 + 4;
        if (0x39 < bVar2) {
          uVar10 = 3;
          if (0x3b < bVar2 && bVar2 != 0x7d) goto LAB_00487e49;
          goto LAB_00487f62;
        }
        uVar10 = 3;
        if (0x22 < bVar2 || bVar2 == 0x21) goto LAB_00487e49;
        goto LAB_00487f62;
      }
      if (bVar2 < 0x22) {
        if (bVar2 != 10) {
          if (bVar2 == 0x21) goto LAB_00487e3e;
          goto LAB_004828e4;
        }
        uVar10 = 0x15;
        pbVar13 = pbVar13 + 1;
        goto joined_r0x00487ea2;
      }
      if (bVar2 == 0x22) goto LAB_00482acd;
      if (0x23 < bVar2) {
        if (bVar2 != 0x2f) goto LAB_00487e3e;
        pbVar4 = pbVar13 + 1;
        bVar2 = pbVar13[1];
        if (bVar2 < 0x2f) {
          if (0x22 < bVar2) {
            if (bVar2 != 0x2a) goto LAB_00487e3e;
            uVar10 = 0x2d;
            pbVar13 = pbVar13 + 2;
            goto joined_r0x00487ea2;
          }
          if (bVar2 == 0x21) goto LAB_00487e3e;
        }
        else if (bVar2 < 0x3c) {
          if (bVar2 == 0x2f) {
            pbVar4 = pbVar13 + 2;
            do {
              pbVar13 = pbVar4 + 1;
              bVar2 = *pbVar4;
              uVar10 = 0x15;
              pbVar4 = pbVar13;
            } while (bVar2 != 10);
            goto joined_r0x00487ea2;
          }
          if (bVar2 < 0x3a) goto LAB_00487e3e;
        }
        else if (bVar2 != 0x7d) goto LAB_00487e3e;
        uVar10 = 0;
        goto LAB_00487f0c;
      }
      bVar2 = pbVar13[1];
      uVar10 = 0;
      if (bVar2 == 0x65) {
        bVar2 = pbVar13[2];
        if (bVar2 != 0x6e) goto LAB_00483516;
        bVar2 = pbVar13[3];
        if (bVar2 != 100) goto LAB_0048351f;
        bVar2 = pbVar13[4];
        lVar9 = 4;
        if (bVar2 == 0x72) goto LAB_00482dd0;
      }
      else {
        lVar9 = 1;
        if (bVar2 != 0x72) goto LAB_00483067;
LAB_00482dd0:
        bVar2 = pbVar13[lVar9 + 1];
        if (bVar2 != 0x65) {
          pbVar13 = pbVar13 + lVar9 + 1;
          goto LAB_00487e49;
        }
        pbVar13 = pbVar13 + lVar9;
        bVar2 = pbVar13[2];
        if (bVar2 != 0x67) goto LAB_00483516;
        bVar2 = pbVar13[3];
        if (bVar2 != 0x69) goto LAB_0048351f;
        bVar2 = pbVar13[4];
        if (bVar2 == 0x6f) {
          bVar2 = pbVar13[5];
          pbVar13 = pbVar13 + 5;
          uVar10 = 0;
          if (bVar2 != 0x6e) goto LAB_00487e49;
          goto LAB_00482e14;
        }
      }
      pbVar13 = pbVar13 + 4;
      uVar10 = 0;
      goto LAB_00487e49;
    }
    if (!tokens) goto LAB_00482208;
    switch(*pbVar13) {
    case 9:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0x20:
      goto LAB_00482f4e;
    case 10:
      pbVar13 = pbVar13 + 1;
      uVar10 = 0x15;
      goto joined_r0x00487ea2;
    default:
      pbVar4 = pbVar13 + 1;
      goto LAB_00483ee8;
    case 0x21:
      if (pbVar13[1] == 0x3d) {
        pbVar13 = pbVar13 + 2;
        this->TokenType = 0x120;
      }
      else {
        pbVar13 = pbVar13 + 1;
        this->TokenType = 0x21;
      }
      goto LAB_004869b2;
    case 0x22:
      goto switchD_0048294f_caseD_22;
    case 0x23:
      pbVar4 = pbVar13 + 1;
      bVar2 = pbVar13[1];
      if (bVar2 < 0x66) {
        if (bVar2 != 0x49) {
          if (bVar2 != 0x65) goto LAB_00483ee8;
          uVar10 = 0;
          if (((pbVar13[2] == 0x6e) && (pbVar13[3] == 100)) && (lVar9 = 4, pbVar13[4] == 0x72))
          goto LAB_00484e64;
          goto LAB_004863f0;
        }
LAB_00484026:
        uVar10 = 0;
        if ((pbVar13[2] & 0xdf) != 0x4e) goto LAB_004863f0;
        if (((((pbVar13[3] & 0xdf) == 0x43) && ((pbVar13[4] & 0xdf) == 0x4c)) &&
            ((pbVar13[5] & 0xdf) == 0x55)) && ((pbVar13[6] & 0xdf) == 0x44)) {
          if ((pbVar13[7] & 0xdf) != 0x45) goto LAB_004863f0;
          pbVar13 = pbVar13 + 8;
          this->TokenType = 0x177;
          goto LAB_004869b2;
        }
      }
      else {
        if (bVar2 < 0x6a) {
          if (bVar2 == 0x69) goto LAB_00484026;
          goto LAB_00483ee8;
        }
        lVar9 = 1;
        if (bVar2 != 0x72) goto LAB_00483ee8;
LAB_00484e64:
        uVar10 = 0;
        if (((pbVar13[lVar9 + 1] == 0x65) && (pbVar13[lVar9 + 2] == 0x67)) &&
           ((pbVar13[lVar9 + 3] == 0x69 && (pbVar13[lVar9 + 4] == 0x6f)))) {
          if (pbVar13[lVar9 + 5] == 0x6e) {
            pbVar4 = pbVar13 + lVar9 + 6;
            do {
              pbVar13 = pbVar4 + 1;
              bVar2 = *pbVar4;
              uVar10 = 0x15;
              pbVar4 = pbVar13;
            } while (bVar2 != 10);
            goto joined_r0x00487ea2;
          }
          goto LAB_004863f0;
        }
      }
      uVar10 = 0;
      goto LAB_004863f0;
    case 0x25:
      if (pbVar13[1] == 0x3d) {
        pbVar13 = pbVar13 + 2;
        this->TokenType = 0x112;
      }
      else {
        pbVar13 = pbVar13 + 1;
        this->TokenType = 0x25;
      }
      goto LAB_004869b2;
    case 0x26:
      if (pbVar13[1] == 0x26) {
        pbVar13 = pbVar13 + 2;
        this->TokenType = 0x11b;
      }
      else if (pbVar13[1] == 0x3d) {
        pbVar13 = pbVar13 + 2;
        this->TokenType = 0x113;
      }
      else {
        pbVar13 = pbVar13 + 1;
        this->TokenType = 0x26;
      }
      goto LAB_004869b2;
    case 0x27:
      pbVar4 = pbVar13 + 1;
      bVar2 = pbVar13[1];
      if (bVar2 == 10) goto LAB_00483ee8;
      pbVar11 = pbVar13 + 2;
      goto LAB_00483669;
    case 0x28:
      pbVar13 = pbVar13 + 1;
      this->TokenType = 0x28;
      goto LAB_004869b2;
    case 0x29:
      pbVar13 = pbVar13 + 1;
      this->TokenType = 0x29;
      goto LAB_004869b2;
    case 0x2a:
      if (pbVar13[1] == 0x2a) {
        pbVar13 = pbVar13 + 2;
        this->TokenType = 0x123;
      }
      else if (pbVar13[1] == 0x3d) {
        pbVar13 = pbVar13 + 2;
        this->TokenType = 0x110;
      }
      else {
        pbVar13 = pbVar13 + 1;
        this->TokenType = 0x2a;
      }
      goto LAB_004869b2;
    case 0x2b:
      if (pbVar13[1] == 0x2b) {
        pbVar13 = pbVar13 + 2;
        this->TokenType = 0x119;
      }
      else if (pbVar13[1] == 0x3d) {
        pbVar13 = pbVar13 + 2;
        this->TokenType = 0x10e;
      }
      else {
        pbVar13 = pbVar13 + 1;
        this->TokenType = 0x2b;
      }
      goto LAB_004869b2;
    case 0x2c:
      pbVar13 = pbVar13 + 1;
      this->TokenType = 0x2c;
      goto LAB_004869b2;
    case 0x2d:
      bVar2 = pbVar13[1];
      if (bVar2 < 0x3d) {
        if (bVar2 == 0x2d) {
          pbVar13 = pbVar13 + 2;
          this->TokenType = 0x11a;
          goto LAB_004869b2;
        }
      }
      else {
        if (bVar2 == 0x3d) {
          pbVar13 = pbVar13 + 2;
          this->TokenType = 0x10f;
          goto LAB_004869b2;
        }
        if (bVar2 < 0x3f) {
          pbVar13 = pbVar13 + 2;
          this->TokenType = 0x124;
          goto LAB_004869b2;
        }
      }
      pbVar13 = pbVar13 + 1;
      this->TokenType = 0x2d;
      goto LAB_004869b2;
    case 0x2e:
      pbVar4 = pbVar13 + 1;
      if (*pbVar4 == 0x2e) {
        if (pbVar13[2] == 0x2e) {
          pbVar13 = pbVar13 + 3;
          this->TokenType = 0x10a;
        }
        else {
          pbVar13 = pbVar13 + 2;
          this->TokenType = 0x109;
        }
      }
      else {
        pbVar13 = pbVar13 + 1;
        if ((byte)(*pbVar4 - 0x30) < 10) goto LAB_00484108;
        this->TokenType = 0x2e;
      }
      goto LAB_004869b2;
    case 0x2f:
      pbVar4 = pbVar13 + 1;
      bVar2 = pbVar13[1];
      if (bVar2 < 0x2f) {
        if (bVar2 != 0x2a) goto LAB_00486402;
        pbVar13 = pbVar13 + 2;
        uVar10 = 0x2d;
        goto joined_r0x00487ea2;
      }
      if (bVar2 != 0x3d) {
        if (bVar2 == 0x2f) {
          pbVar4 = pbVar13 + 2;
          do {
            pbVar13 = pbVar4 + 1;
            bVar2 = *pbVar4;
            uVar10 = 0x15;
            pbVar4 = pbVar13;
          } while (bVar2 != 10);
          goto joined_r0x00487ea2;
        }
        goto LAB_00486402;
      }
      pbVar13 = pbVar13 + 2;
      this->TokenType = 0x111;
      goto LAB_004869b2;
    case 0x30:
      pbVar4 = pbVar13 + 1;
      bVar2 = pbVar13[1];
      pbVar11 = pbVar4;
      if (bVar2 < 0x56) {
        if (0x44 < bVar2) {
          if (0x4b < bVar2) {
            if (bVar2 != 0x4c) goto joined_r0x00483087;
            goto LAB_00486c15;
          }
          uVar10 = 2;
          if (bVar2 == 0x45) goto LAB_00485be4;
          goto LAB_00486c33;
        }
        if (bVar2 < 0x2f) {
          pbVar13 = pbVar4;
          if (bVar2 == 0x2e) goto LAB_00484108;
          goto LAB_00486c33;
        }
        if (0x39 < bVar2 || bVar2 == 0x2f) goto LAB_00486c33;
        goto LAB_00482cfb;
      }
      if (bVar2 < 0x6c) {
        if (0x58 < bVar2) {
          uVar10 = 2;
          if (bVar2 == 0x65) goto LAB_00485be4;
          goto LAB_00486c33;
        }
        if (bVar2 != 0x58) goto LAB_00486c33;
      }
      else {
        if (bVar2 < 0x76) {
          if (bVar2 != 0x6c) goto joined_r0x00484ef8;
          goto LAB_00486c15;
        }
        if (bVar2 != 0x78) goto LAB_00486c33;
      }
      bVar2 = pbVar13[2];
      if (bVar2 < 0x41) {
        uVar10 = 2;
        if (9 < (byte)(bVar2 - 0x30)) goto LAB_004863f0;
      }
      else {
        uVar10 = 2;
        if (5 < (byte)(bVar2 + 0x9f) && 0x46 < bVar2) goto LAB_004863f0;
      }
      pbVar4 = pbVar13 + 3;
      goto LAB_004863a8;
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
      pbVar4 = pbVar13;
      goto LAB_00482cfb;
    case 0x3a:
      if (pbVar13[1] == 0x3a) {
        pbVar13 = pbVar13 + 2;
        this->TokenType = 0x108;
      }
      else {
        pbVar13 = pbVar13 + 1;
        this->TokenType = 0x3a;
      }
      goto LAB_004869b2;
    case 0x3b:
      pbVar13 = pbVar13 + 1;
      this->StateOptions = false;
      this->TokenType = 0x3b;
      goto LAB_004869b2;
    case 0x3c:
      pbVar4 = pbVar13 + 1;
      bVar2 = pbVar13[1];
      if (bVar2 < 0x3c) goto LAB_00486434;
      if (bVar2 == 0x3c) {
        if (pbVar13[2] == 0x3d) {
          pbVar13 = pbVar13 + 3;
          this->TokenType = 0x10d;
        }
        else {
          pbVar13 = pbVar13 + 2;
          this->TokenType = 0x118;
        }
        goto LAB_004869b2;
      }
      if (bVar2 < 0x3e) {
        pbVar13 = pbVar13 + 2;
        this->TokenType = 0x11d;
        goto LAB_004869b2;
      }
      if (bVar2 != 0x3e) goto LAB_00486434;
      uVar10 = 3;
      if (pbVar13[2] != 0x3d) goto LAB_004863f0;
      pbVar13 = pbVar13 + 3;
      this->TokenType = 0x122;
      goto LAB_004869b2;
    case 0x3d:
      if (pbVar13[1] == 0x3d) {
        pbVar13 = pbVar13 + 2;
        this->TokenType = 0x11f;
      }
      else {
        pbVar13 = pbVar13 + 1;
        this->TokenType = 0x3d;
      }
      goto LAB_004869b2;
    case 0x3e:
      bVar2 = pbVar13[1];
      if (0x3c < bVar2) {
        if (bVar2 == 0x3d) {
          pbVar13 = pbVar13 + 2;
          this->TokenType = 0x11e;
          goto LAB_004869b2;
        }
        if (bVar2 < 0x3f) {
          bVar2 = pbVar13[2];
          if (0x3c < bVar2) {
            if (bVar2 == 0x3d) {
              pbVar13 = pbVar13 + 3;
              this->TokenType = 0x10b;
              goto LAB_004869b2;
            }
            if (bVar2 < 0x3f) {
              if (pbVar13[3] == 0x3d) {
                pbVar13 = pbVar13 + 4;
                this->TokenType = 0x10c;
              }
              else {
                pbVar13 = pbVar13 + 3;
                this->TokenType = 0x117;
              }
              goto LAB_004869b2;
            }
          }
          pbVar13 = pbVar13 + 2;
          this->TokenType = 0x116;
          goto LAB_004869b2;
        }
      }
      pbVar13 = pbVar13 + 1;
      this->TokenType = 0x3e;
      goto LAB_004869b2;
    case 0x3f:
      pbVar13 = pbVar13 + 1;
      this->TokenType = 0x3f;
      goto LAB_004869b2;
    case 0x41:
    case 0x61:
      pbVar11 = pbVar13 + 1;
      bVar2 = pbVar13[1];
      if (bVar2 < 0x56) {
        if (0x4b < bVar2) {
          if (bVar2 < 0x52) {
            if (bVar2 != 0x4c) goto switchD_00483261_caseD_4a;
            goto LAB_00485108;
          }
          if (bVar2 == 0x52) goto LAB_0048547c;
          if (bVar2 != 0x55) goto switchD_00483261_caseD_4a;
LAB_0048519d:
          bVar2 = pbVar13[2];
          if ((bVar2 & 0xdf) != 0x54) goto LAB_00485940;
          bVar2 = pbVar13[3];
          if ((bVar2 & 0xdf) != 0x4f) goto LAB_00486716;
          bVar2 = pbVar13[4];
          pbVar11 = pbVar13 + 4;
          if (bVar2 < 0x5b) {
            bVar15 = 0x2f < bVar2;
            bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00486e2b:
            if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
          }
          else {
            if (0x5f < bVar2) {
              bVar15 = bVar2 != 0x60;
              bVar14 = bVar2 < 0x7b;
              goto LAB_00486e2b;
            }
            if (bVar2 == 0x5f) goto LAB_0048805a;
          }
          this->TokenType = 0x155;
          goto LAB_0048807b;
        }
        if (bVar2 < 0x42) goto switchD_00483261_caseD_4a;
        if (bVar2 != 0x42) {
          if (0x43 < bVar2) goto switchD_00483261_caseD_4a;
LAB_004858dc:
          bVar2 = pbVar13[2];
          if ((bVar2 & 0xdf) != 0x54) goto LAB_00485940;
          bVar2 = pbVar13[3];
          if ((bVar2 & 0xdf) != 0x49) goto LAB_00486716;
          bVar2 = pbVar13[4];
          if ((bVar2 & 0xdf) != 0x4f) goto LAB_0048719a;
          bVar2 = pbVar13[5];
          if ((bVar2 & 0xdf) != 0x4e) goto LAB_00487277;
          bVar2 = pbVar13[6];
          pbVar11 = pbVar13 + 6;
          if (bVar2 < 0x5b) {
            bVar15 = 0x2f < bVar2;
            bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_004877a5:
            if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
          }
          else {
            if (0x5f < bVar2) {
              bVar15 = bVar2 != 0x60;
              bVar14 = bVar2 < 0x7b;
              goto LAB_004877a5;
            }
            if (bVar2 == 0x5f) goto LAB_0048805a;
          }
          this->TokenType = 0x125;
          goto LAB_0048807b;
        }
LAB_00483a23:
        bVar2 = pbVar13[2];
        if ((bVar2 & 0xdf) != 0x53) goto LAB_00485940;
        bVar2 = pbVar13[3];
        if ((bVar2 & 0xdf) != 0x54) goto LAB_00486716;
        bVar2 = pbVar13[4];
        if ((bVar2 & 0xdf) != 0x52) goto LAB_0048719a;
        bVar2 = pbVar13[5];
        if ((bVar2 & 0xdf) != 0x41) goto LAB_00487277;
        bVar2 = pbVar13[6];
        if ((bVar2 & 0xdf) != 0x43) {
          pbVar11 = pbVar13 + 6;
          goto switchD_00483261_caseD_4a;
        }
        bVar2 = pbVar13[7];
        if ((bVar2 & 0xdf) != 0x54) goto LAB_004871a9;
        bVar2 = pbVar13[8];
        pbVar11 = pbVar13 + 8;
        if (bVar2 < 0x5b) {
          bVar15 = 0x2f < bVar2;
          bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00487b30:
          if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
        }
        else {
          if (0x5f < bVar2) {
            bVar15 = bVar2 != 0x60;
            bVar14 = bVar2 < 0x7b;
            goto LAB_00487b30;
          }
          if (bVar2 == 0x5f) goto LAB_0048805a;
        }
        this->TokenType = 0x14e;
      }
      else {
        if (0x6c < bVar2) {
          if (0x72 < bVar2) {
            if (bVar2 != 0x75) goto switchD_00483261_caseD_4a;
            goto LAB_0048519d;
          }
          if (bVar2 != 0x72) goto switchD_00483261_caseD_4a;
LAB_0048547c:
          bVar2 = pbVar13[2];
          if ((bVar2 & 0xdf) != 0x52) goto LAB_00485940;
          bVar2 = pbVar13[3];
          if ((bVar2 & 0xdf) != 0x41) goto LAB_00486716;
          bVar2 = pbVar13[4];
          if ((bVar2 & 0xdf) != 0x59) goto LAB_0048719a;
          bVar2 = pbVar13[5];
          pbVar11 = pbVar13 + 5;
          if (bVar2 < 0x5b) {
            bVar15 = 0x2f < bVar2;
            bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_004872e5:
            if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
          }
          else {
            if (0x5f < bVar2) {
              bVar15 = bVar2 != 0x60;
              bVar14 = bVar2 < 0x7b;
              goto LAB_004872e5;
            }
            if (bVar2 == 0x5f) goto LAB_0048805a;
          }
          this->TokenType = 0x17d;
          goto LAB_0048807b;
        }
        if (bVar2 < 99) {
          if (bVar2 != 0x62) goto switchD_00483261_caseD_4a;
          goto LAB_00483a23;
        }
        if (bVar2 == 99) goto LAB_004858dc;
        if (bVar2 != 0x6c) goto switchD_00483261_caseD_4a;
LAB_00485108:
        bVar2 = pbVar13[2];
        if ((bVar2 & 0xdf) != 0x49) goto LAB_00485940;
        bVar2 = pbVar13[3];
        if ((bVar2 & 0xdf) != 0x47) goto LAB_00486716;
        bVar2 = pbVar13[4];
        if ((bVar2 & 0xdf) != 0x4e) goto LAB_0048719a;
        bVar2 = pbVar13[5];
        if ((bVar2 & 0xdf) != 0x4f) goto LAB_00487277;
        bVar2 = pbVar13[6];
        if ((bVar2 & 0xdf) != 0x46) goto LAB_004871a3;
        bVar2 = pbVar13[7];
        pbVar11 = pbVar13 + 7;
        if (bVar2 < 0x5b) {
          bVar15 = 0x2f < bVar2;
          bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00487905:
          if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
        }
        else {
          if (0x5f < bVar2) {
            bVar15 = bVar2 != 0x60;
            bVar14 = bVar2 < 0x7b;
            goto LAB_00487905;
          }
          if (bVar2 == 0x5f) goto LAB_0048805a;
        }
        this->TokenType = 0x180;
      }
      goto LAB_0048807b;
    case 0x42:
    case 0x62:
      pbVar11 = pbVar13 + 1;
      bVar2 = pbVar13[1];
      if (0x59 < bVar2) {
        if (bVar2 < 0x72) {
          if (bVar2 != 0x6f) goto switchD_00483261_caseD_4a;
LAB_00483c2e:
          bVar2 = pbVar13[2];
          if ((bVar2 & 0xdf) != 0x4f) goto LAB_00485940;
          bVar2 = pbVar13[3];
          if ((bVar2 & 0xdf) != 0x4c) goto LAB_00486716;
          bVar2 = pbVar13[4];
          pbVar11 = pbVar13 + 4;
          if (bVar2 < 0x5b) {
            bVar15 = 0x2f < bVar2;
            bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00486817:
            if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
          }
          else {
            if (0x5f < bVar2) {
              bVar15 = bVar2 != 0x60;
              bVar14 = bVar2 < 0x7b;
              goto LAB_00486817;
            }
            if (bVar2 == 0x5f) goto LAB_0048805a;
          }
          this->TokenType = 0x133;
        }
        else {
          if (bVar2 == 0x72) goto LAB_00484b80;
          if (bVar2 != 0x79) goto switchD_00483261_caseD_4a;
LAB_0048441c:
          bVar2 = pbVar13[2];
          if ((bVar2 & 0xdf) != 0x54) goto LAB_00485940;
          bVar2 = pbVar13[3];
          if ((bVar2 & 0xdf) != 0x45) goto LAB_00486716;
          bVar2 = pbVar13[4];
          pbVar11 = pbVar13 + 4;
          if (bVar2 < 0x5b) {
            bVar15 = 0x2f < bVar2;
            bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00486afe:
            if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
          }
          else {
            if (0x5f < bVar2) {
              bVar15 = bVar2 != 0x60;
              bVar14 = bVar2 < 0x7b;
              goto LAB_00486afe;
            }
            if (bVar2 == 0x5f) goto LAB_0048805a;
          }
          this->TokenType = 0x138;
        }
        goto LAB_0048807b;
      }
      if (bVar2 < 0x52) {
        if (bVar2 != 0x4f) goto switchD_00483261_caseD_4a;
        goto LAB_00483c2e;
      }
      if (bVar2 != 0x52) {
        if (bVar2 != 0x59) goto switchD_00483261_caseD_4a;
        goto LAB_0048441c;
      }
LAB_00484b80:
      pbVar11 = pbVar13 + 2;
      bVar2 = pbVar13[2];
      if (bVar2 < 0x4a) {
        if (bVar2 == 0x45) {
LAB_00485777:
          bVar2 = pbVar13[3];
          if ((bVar2 & 0xdf) != 0x41) goto LAB_00486716;
          bVar2 = pbVar13[4];
          if ((bVar2 & 0xdf) != 0x4b) goto LAB_0048719a;
          bVar2 = pbVar13[5];
          pbVar11 = pbVar13 + 5;
          if (bVar2 < 0x5b) {
            bVar15 = 0x2f < bVar2;
            bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_0048736d:
            if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
          }
          else {
            if (0x5f < bVar2) {
              bVar15 = bVar2 != 0x60;
              bVar14 = bVar2 < 0x7b;
              goto LAB_0048736d;
            }
            if (bVar2 == 0x5f) goto LAB_0048805a;
          }
          this->TokenType = 0x126;
          goto LAB_0048807b;
        }
        if (bVar2 != 0x49) goto switchD_00483261_caseD_4a;
      }
      else {
        if (bVar2 < 0x66) {
          if (bVar2 != 0x65) goto switchD_00483261_caseD_4a;
          goto LAB_00485777;
        }
        if (bVar2 != 0x69) goto switchD_00483261_caseD_4a;
      }
      bVar2 = pbVar13[3];
      if ((bVar2 & 0xdf) != 0x47) goto LAB_00486716;
      bVar2 = pbVar13[4];
      if ((bVar2 & 0xdf) != 0x48) goto LAB_0048719a;
      bVar2 = pbVar13[5];
      if ((bVar2 & 0xdf) != 0x54) goto LAB_00487277;
      bVar2 = pbVar13[6];
      pbVar11 = pbVar13 + 6;
      if (bVar2 < 0x5b) {
        bVar15 = 0x2f < bVar2;
        bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_004875ba:
        if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
      }
      else {
        if (0x5f < bVar2) {
          bVar15 = bVar2 != 0x60;
          bVar14 = bVar2 < 0x7b;
          goto LAB_004875ba;
        }
        if (bVar2 == 0x5f) goto LAB_0048805a;
      }
      bVar15 = this->StateOptions == false;
      iVar3 = 0x18e;
      break;
    case 0x43:
    case 99:
      pbVar11 = pbVar13 + 1;
      bVar2 = pbVar13[1];
      if (0x60 < bVar2) {
        if (bVar2 < 0x6c) {
          if (bVar2 == 0x61) goto LAB_004849c2;
          if (bVar2 != 0x68) goto switchD_00483261_caseD_4a;
LAB_00484957:
          bVar2 = pbVar13[2];
          if ((bVar2 & 0xdf) != 0x41) goto LAB_00485940;
          bVar2 = pbVar13[3];
          if ((bVar2 & 0xdf) != 0x52) goto LAB_00486716;
          bVar2 = pbVar13[4];
          pbVar11 = pbVar13 + 4;
          if (bVar2 < 0x5b) {
            bVar15 = 0x2f < bVar2;
            bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00486a38:
            if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
          }
          else {
            if (0x5f < bVar2) {
              bVar15 = bVar2 != 0x60;
              bVar14 = bVar2 < 0x7b;
              goto LAB_00486a38;
            }
            if (bVar2 == 0x5f) goto LAB_0048805a;
          }
          this->TokenType = 0x137;
          goto LAB_0048807b;
        }
        if (bVar2 == 0x6c) {
LAB_004849ea:
          bVar2 = pbVar13[2];
          if ((bVar2 & 0xdf) != 0x41) goto LAB_00485940;
          bVar2 = pbVar13[3];
          if ((bVar2 & 0xdf) != 0x53) goto LAB_00486716;
          bVar2 = pbVar13[4];
          if ((bVar2 & 0xdf) != 0x53) goto LAB_0048719a;
          bVar2 = pbVar13[5];
          pbVar11 = pbVar13 + 5;
          if (bVar2 < 0x5b) {
            bVar15 = 0x2f < bVar2;
            bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00486ee0:
            if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
          }
          else {
            if (0x5f < bVar2) {
              bVar15 = bVar2 != 0x60;
              bVar14 = bVar2 < 0x7b;
              goto LAB_00486ee0;
            }
            if (bVar2 == 0x5f) goto LAB_0048805a;
          }
          this->TokenType = 0x146;
          goto LAB_0048807b;
        }
        if (bVar2 == 0x6f) goto LAB_00484a41;
        if (bVar2 != 0x72) goto switchD_00483261_caseD_4a;
LAB_00483bc5:
        bVar2 = pbVar13[2];
        if ((bVar2 & 0xdf) != 0x4f) goto LAB_00485940;
        bVar2 = pbVar13[3];
        if ((bVar2 & 0xdf) != 0x53) goto LAB_00486716;
        bVar2 = pbVar13[4];
        if ((bVar2 & 0xdf) != 0x53) goto LAB_0048719a;
        bVar2 = pbVar13[5];
        pbVar11 = pbVar13 + 5;
        if (bVar2 < 0x5b) {
          bVar15 = 0x2f < bVar2;
          bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00486f00:
          if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
        }
        else {
          if (0x5f < bVar2) {
            bVar15 = bVar2 != 0x60;
            bVar14 = bVar2 < 0x7b;
            goto LAB_00486f00;
          }
          if (bVar2 == 0x5f) goto LAB_0048805a;
        }
        this->TokenType = 0x167;
        goto LAB_0048807b;
      }
      if (bVar2 < 0x4c) {
        if (bVar2 != 0x41) {
          if (bVar2 != 0x48) goto switchD_00483261_caseD_4a;
          goto LAB_00484957;
        }
LAB_004849c2:
        pbVar11 = pbVar13 + 2;
        bVar2 = pbVar13[2];
        if (bVar2 < 0x54) {
          if (bVar2 == 0x4e) {
LAB_00485527:
            bVar2 = pbVar13[3];
            if ((bVar2 & 0xdf) != 0x52) goto LAB_00486716;
            bVar2 = pbVar13[4];
            if ((bVar2 & 0xdf) != 0x41) goto LAB_0048719a;
            bVar2 = pbVar13[5];
            if ((bVar2 & 0xdf) != 0x49) goto LAB_00487277;
            bVar2 = pbVar13[6];
            if ((bVar2 & 0xdf) != 0x53) goto LAB_004871a3;
            bVar2 = pbVar13[7];
            if ((bVar2 & 0xdf) != 0x45) goto LAB_004871a9;
            bVar2 = pbVar13[8];
            pbVar11 = pbVar13 + 8;
            if (bVar2 < 0x5b) {
              bVar15 = 0x2f < bVar2;
              bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00487b90:
              if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
            }
            else {
              if (0x5f < bVar2) {
                bVar15 = bVar2 != 0x60;
                bVar14 = bVar2 < 0x7b;
                goto LAB_00487b90;
              }
              if (bVar2 == 0x5f) goto LAB_0048805a;
            }
            bVar15 = this->StateOptions == false;
            iVar3 = 0x188;
            break;
          }
          if (bVar2 != 0x53) goto switchD_00483261_caseD_4a;
        }
        else {
          if (bVar2 < 0x6f) {
            if (bVar2 != 0x6e) goto switchD_00483261_caseD_4a;
            goto LAB_00485527;
          }
          if (bVar2 != 0x73) goto switchD_00483261_caseD_4a;
        }
        bVar2 = pbVar13[3];
        if ((bVar2 & 0xdf) != 0x45) goto LAB_00486716;
        bVar2 = pbVar13[4];
        pbVar11 = pbVar13 + 4;
        if (bVar2 < 0x5b) {
          bVar15 = 0x2f < bVar2;
          bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00486df7:
          if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
        }
        else {
          if (0x5f < bVar2) {
            bVar15 = bVar2 != 0x60;
            bVar14 = bVar2 < 0x7b;
            goto LAB_00486df7;
          }
          if (bVar2 == 0x5f) goto LAB_0048805a;
        }
        this->TokenType = 0x127;
        goto LAB_0048807b;
      }
      if (bVar2 == 0x4c) goto LAB_004849ea;
      if (bVar2 != 0x4f) {
        if (bVar2 != 0x52) goto switchD_00483261_caseD_4a;
        goto LAB_00483bc5;
      }
LAB_00484a41:
      pbVar11 = pbVar13 + 2;
      bVar2 = pbVar13[2];
      if (bVar2 < 0x4f) {
        if (0x4b < bVar2) {
          if (bVar2 != 0x4c) {
            if (bVar2 != 0x4e) goto switchD_00483261_caseD_4a;
            goto LAB_00485f04;
          }
LAB_00486468:
          bVar2 = pbVar13[3];
          if ((bVar2 & 0xdf) != 0x4f) goto LAB_00486716;
          bVar2 = pbVar13[4];
          if ((bVar2 & 0xdf) != 0x52) goto LAB_0048719a;
          bVar2 = pbVar13[5];
          pbVar11 = pbVar13 + 5;
          if (bVar2 < 0x5b) {
            bVar15 = 0x2f < bVar2;
            bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_004874d4:
            if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
          }
          else {
            if (0x5f < bVar2) {
              bVar15 = bVar2 != 0x60;
              bVar14 = bVar2 < 0x7b;
              goto LAB_004874d4;
            }
            if (bVar2 == 0x5f) goto LAB_0048805a;
          }
          this->TokenType = 0x14c;
          goto LAB_0048807b;
        }
        if (bVar2 != 0x45) goto switchD_00483261_caseD_4a;
LAB_004855b2:
        bVar2 = pbVar13[3];
        if ((bVar2 & 0xdf) != 0x52) goto LAB_00486716;
        bVar2 = pbVar13[4];
        if ((bVar2 & 0xdf) != 0x43) goto LAB_0048719a;
        bVar2 = pbVar13[5];
        if ((bVar2 & 0xdf) != 0x45) goto LAB_00487277;
        bVar2 = pbVar13[6];
        pbVar11 = pbVar13 + 6;
        if (bVar2 < 0x5b) {
          bVar15 = 0x2f < bVar2;
          bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_004875f3:
          if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
        }
        else {
          if (0x5f < bVar2) {
            bVar15 = bVar2 != 0x60;
            bVar14 = bVar2 < 0x7b;
            goto LAB_004875f3;
          }
          if (bVar2 == 0x5f) goto LAB_0048805a;
        }
        this->TokenType = 0x16d;
        goto LAB_0048807b;
      }
      if (bVar2 < 0x6c) {
        if (bVar2 != 0x65) goto switchD_00483261_caseD_4a;
        goto LAB_004855b2;
      }
      if (bVar2 == 0x6c) goto LAB_00486468;
      if (bVar2 != 0x6e) goto switchD_00483261_caseD_4a;
LAB_00485f04:
      pbVar11 = pbVar13 + 3;
      bVar2 = pbVar13[3];
      if (bVar2 < 0x55) {
        bVar15 = bVar2 == 0x46;
        if (0x46 < bVar2) {
          if (bVar2 < 0x53) goto switchD_00483261_caseD_4a;
          if (bVar2 == 0x54) goto LAB_0048713e;
LAB_00486c7d:
          bVar2 = pbVar13[4];
          if ((bVar2 & 0xdf) != 0x54) goto LAB_0048719a;
          bVar2 = pbVar13[5];
          pbVar11 = pbVar13 + 5;
          if (bVar2 < 0x5b) {
            bVar15 = 0x2f < bVar2;
            bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00487975:
            if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
          }
          else {
            if (0x5f < bVar2) {
              bVar15 = bVar2 != 0x60;
              bVar14 = bVar2 < 0x7b;
              goto LAB_00487975;
            }
            if (bVar2 == 0x5f) goto LAB_0048805a;
          }
          this->TokenType = 0x128;
          goto LAB_0048807b;
        }
LAB_0048685a:
        if (!bVar15) goto switchD_00483261_caseD_4a;
        bVar2 = pbVar13[4];
        if ((bVar2 & 0xdf) != 0x49) goto LAB_0048719a;
        bVar2 = pbVar13[5];
        if ((bVar2 & 0xdf) != 0x47) goto LAB_00487277;
        bVar2 = pbVar13[6];
        pbVar11 = pbVar13 + 6;
        if (bVar2 < 0x5b) {
          bVar15 = 0x2f < bVar2;
          bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00487b50:
          if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
        }
        else {
          if (0x5f < bVar2) {
            bVar15 = bVar2 != 0x60;
            bVar14 = bVar2 < 0x7b;
            goto LAB_00487b50;
          }
          if (bVar2 == 0x5f) goto LAB_0048805a;
        }
        this->TokenType = 0x16c;
        goto LAB_0048807b;
      }
      if (bVar2 < 0x73) {
        bVar15 = bVar2 == 0x66;
        goto LAB_0048685a;
      }
      if (bVar2 == 0x73) goto LAB_00486c7d;
      if (0x74 < bVar2) goto switchD_00483261_caseD_4a;
LAB_0048713e:
      bVar2 = pbVar13[4];
      if ((bVar2 & 0xdf) != 0x49) goto LAB_0048719a;
      bVar2 = pbVar13[5];
      if ((bVar2 & 0xdf) != 0x4e) goto LAB_00487277;
      bVar2 = pbVar13[6];
      if ((bVar2 & 0xdf) != 0x55) goto LAB_004871a3;
      bVar2 = pbVar13[7];
      if ((bVar2 & 0xdf) != 0x45) goto LAB_004871a9;
      bVar2 = pbVar13[8];
      pbVar11 = pbVar13 + 8;
      if (bVar2 < 0x5b) {
        bVar15 = 0x2f < bVar2;
        bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00487dce:
        if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
      }
      else {
        if (0x5f < bVar2) {
          bVar15 = bVar2 != 0x60;
          bVar14 = bVar2 < 0x7b;
          goto LAB_00487dce;
        }
        if (bVar2 == 0x5f) goto LAB_0048805a;
      }
      this->TokenType = 0x129;
      goto LAB_0048807b;
    case 0x44:
    case 100:
      pbVar11 = pbVar13 + 1;
      bVar2 = pbVar13[1];
      if (bVar2 < 0x50) {
        if (bVar2 == 0x45) {
LAB_00483c83:
          pbVar11 = pbVar13 + 2;
          bVar2 = pbVar13[2];
          if (bVar2 < 0x51) {
            if (bVar2 != 0x46) {
              if (bVar2 != 0x50) goto switchD_00483261_caseD_4a;
LAB_00485995:
              bVar2 = pbVar13[3];
              if ((bVar2 & 0xdf) != 0x52) goto LAB_00486716;
              bVar2 = pbVar13[4];
              if ((bVar2 & 0xdf) != 0x45) goto LAB_0048719a;
              bVar2 = pbVar13[5];
              if ((bVar2 & 0xdf) != 0x43) goto LAB_00487277;
              bVar2 = pbVar13[6];
              if ((bVar2 & 0xdf) != 0x41) goto LAB_004871a3;
              bVar2 = pbVar13[7];
              if ((bVar2 & 0xdf) != 0x54) goto LAB_004871a9;
              bVar2 = pbVar13[8];
              if ((bVar2 & 0xdf) != 0x45) goto LAB_004876ee;
              bVar2 = pbVar13[9];
              if ((bVar2 & 0xdf) != 0x44) goto LAB_0048773f;
              bVar2 = pbVar13[10];
              pbVar11 = pbVar13 + 10;
              if (bVar2 < 0x5b) {
                bVar15 = 0x2f < bVar2;
                bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00487d24:
                if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
              }
              else {
                if (0x5f < bVar2) {
                  bVar15 = bVar2 != 0x60;
                  bVar14 = bVar2 < 0x7b;
                  goto LAB_00487d24;
                }
                if (bVar2 == 0x5f) goto LAB_0048805a;
              }
              this->TokenType = 0x186;
              goto LAB_0048807b;
            }
          }
          else {
            if (0x66 < bVar2) {
              if (bVar2 != 0x70) goto switchD_00483261_caseD_4a;
              goto LAB_00485995;
            }
            if (bVar2 != 0x66) goto switchD_00483261_caseD_4a;
          }
          bVar2 = pbVar13[3];
          if ((bVar2 & 0xdf) != 0x41) goto LAB_00486716;
          bVar2 = pbVar13[4];
          if ((bVar2 & 0xdf) != 0x55) goto LAB_0048719a;
          bVar2 = pbVar13[5];
          if ((bVar2 & 0xdf) != 0x4c) goto LAB_00487277;
          bVar2 = pbVar13[6];
          if ((bVar2 & 0xdf) != 0x54) goto LAB_004871a3;
          pbVar11 = pbVar13 + 7;
          bVar2 = pbVar13[7];
          if (bVar2 < 0x5b) {
            if (0x40 < bVar2) {
              if (bVar2 != 0x50) goto LAB_0048805a;
LAB_00487631:
              bVar2 = pbVar13[8];
              if ((bVar2 & 0xdf) != 0x52) goto LAB_004876ee;
              bVar2 = pbVar13[9];
              if ((bVar2 & 0xdf) != 0x4f) {
LAB_0048773f:
                pbVar11 = pbVar13 + 9;
                goto switchD_00483261_caseD_4a;
              }
              bVar2 = pbVar13[10];
              if ((bVar2 & 0xdf) != 0x50) {
                pbVar11 = pbVar13 + 10;
                goto switchD_00483261_caseD_4a;
              }
              bVar2 = pbVar13[0xb];
              if ((bVar2 & 0xdf) != 0x45) {
                pbVar11 = pbVar13 + 0xb;
                goto switchD_00483261_caseD_4a;
              }
              bVar2 = pbVar13[0xc];
              if ((bVar2 & 0xdf) != 0x52) {
                pbVar11 = pbVar13 + 0xc;
                goto switchD_00483261_caseD_4a;
              }
              bVar2 = pbVar13[0xd];
              if ((bVar2 & 0xdf) != 0x54) {
                pbVar11 = pbVar13 + 0xd;
                goto switchD_00483261_caseD_4a;
              }
              bVar2 = pbVar13[0xe];
              if ((bVar2 & 0xdf) != 0x49) {
                pbVar11 = pbVar13 + 0xe;
                goto switchD_00483261_caseD_4a;
              }
              bVar2 = pbVar13[0xf];
              if ((bVar2 & 0xdf) != 0x45) {
                pbVar11 = pbVar13 + 0xf;
                goto switchD_00483261_caseD_4a;
              }
              bVar2 = pbVar13[0x10];
              if ((bVar2 & 0xdf) != 0x53) {
                pbVar11 = pbVar13 + 0x10;
                goto switchD_00483261_caseD_4a;
              }
              bVar2 = pbVar13[0x11];
              pbVar11 = pbVar13 + 0x11;
              if (bVar2 < 0x5b) {
                bVar15 = 0x2f < bVar2;
                bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00487e27:
                if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
              }
              else {
                if (0x5f < bVar2) {
                  bVar15 = bVar2 != 0x60;
                  bVar14 = bVar2 < 0x7b;
                  goto LAB_00487e27;
                }
                if (bVar2 == 0x5f) goto LAB_0048805a;
              }
              this->TokenType = 0x157;
              goto LAB_0048807b;
            }
            if ((byte)(bVar2 - 0x30) < 10) goto LAB_0048805a;
          }
          else if (bVar2 < 0x61) {
            if (bVar2 == 0x5f) goto LAB_0048805a;
          }
          else {
            if (bVar2 == 0x70) goto LAB_00487631;
            if (bVar2 < 0x7b) goto LAB_0048805a;
          }
          this->TokenType = 0x12a;
          goto LAB_0048807b;
        }
        if (bVar2 != 0x4f) goto switchD_00483261_caseD_4a;
      }
      else {
        if (bVar2 < 0x66) {
          if (bVar2 != 0x65) goto switchD_00483261_caseD_4a;
          goto LAB_00483c83;
        }
        if (bVar2 != 0x6f) goto switchD_00483261_caseD_4a;
      }
      pbVar11 = pbVar13 + 2;
      bVar2 = pbVar13[2];
      if (bVar2 < 0x5b) {
        if (0x40 < bVar2) {
          if (bVar2 < 0x54) goto LAB_0048805a;
          if (bVar2 == 0x54) {
LAB_0048596b:
            bVar2 = pbVar13[3];
            pbVar13 = pbVar13 + 3;
            if (bVar2 < 0x5b) {
              bVar15 = 0x2f < bVar2;
              bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_004869a0:
              if ((bool)(bVar15 & bVar14)) goto switchD_0048294f_caseD_48;
            }
            else {
              if (0x5f < bVar2) {
                bVar15 = bVar2 != 0x60;
                bVar14 = bVar2 < 0x7b;
                goto LAB_004869a0;
              }
              if (bVar2 == 0x5f) goto switchD_0048294f_caseD_48;
            }
            this->TokenType = 0x166;
            goto LAB_004869b2;
          }
          if (0x55 < bVar2) goto LAB_0048805a;
LAB_00486228:
          bVar2 = pbVar13[3];
          if ((bVar2 & 0xdf) != 0x42) goto LAB_00486716;
          bVar2 = pbVar13[4];
          if ((bVar2 & 0xdf) != 0x4c) goto LAB_0048719a;
          bVar2 = pbVar13[5];
          if ((bVar2 & 0xdf) != 0x45) goto LAB_00487277;
          bVar2 = pbVar13[6];
          pbVar11 = pbVar13 + 6;
          if (bVar2 < 0x5b) {
            bVar15 = 0x2f < bVar2;
            bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_004878b1:
            if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
          }
          else {
            if (0x5f < bVar2) {
              bVar15 = bVar2 != 0x60;
              bVar14 = bVar2 < 0x7b;
              goto LAB_004878b1;
            }
            if (bVar2 == 0x5f) goto LAB_0048805a;
          }
          this->TokenType = 0x136;
          goto LAB_0048807b;
        }
        if ((byte)(bVar2 - 0x30) < 10) goto LAB_0048805a;
      }
      else if (bVar2 < 0x74) {
        if (0x60 < bVar2 || bVar2 == 0x5f) goto LAB_0048805a;
      }
      else {
        if (bVar2 == 0x74) goto LAB_0048596b;
        if (bVar2 < 0x76) goto LAB_00486228;
        if (bVar2 < 0x7b) goto LAB_0048805a;
      }
      this->TokenType = 299;
      goto LAB_0048807b;
    case 0x45:
    case 0x65:
      pbVar11 = pbVar13 + 1;
      bVar2 = pbVar13[1];
      if (bVar2 < 0x6c) {
        if (bVar2 < 0x56) {
          if (bVar2 != 0x4c) {
            if (bVar2 != 0x4e) goto switchD_00483261_caseD_4a;
            goto LAB_00483cc6;
          }
LAB_00484743:
          bVar2 = pbVar13[2];
          if ((bVar2 & 0xdf) != 0x53) goto LAB_00485940;
          bVar2 = pbVar13[3];
          if ((bVar2 & 0xdf) != 0x45) goto LAB_00486716;
          bVar2 = pbVar13[4];
          pbVar11 = pbVar13 + 4;
          if (bVar2 < 0x5b) {
            bVar15 = 0x2f < bVar2;
            bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_004868d7:
            if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
          }
          else {
            if (0x5f < bVar2) {
              bVar15 = bVar2 != 0x60;
              bVar14 = bVar2 < 0x7b;
              goto LAB_004868d7;
            }
            if (bVar2 == 0x5f) goto LAB_0048805a;
          }
          this->TokenType = 300;
        }
        else {
          if (bVar2 != 0x56) {
            if (bVar2 != 0x58) goto switchD_00483261_caseD_4a;
            goto LAB_004844ba;
          }
LAB_00484789:
          bVar2 = pbVar13[2];
          if ((bVar2 & 0xdf) != 0x45) goto LAB_00485940;
          bVar2 = pbVar13[3];
          if ((bVar2 & 0xdf) != 0x4e) goto LAB_00486716;
          bVar2 = pbVar13[4];
          if ((bVar2 & 0xdf) != 0x54) goto LAB_0048719a;
          bVar2 = pbVar13[5];
          pbVar11 = pbVar13 + 5;
          if (bVar2 < 0x5b) {
            bVar15 = 0x2f < bVar2;
            bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00486d63:
            if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
          }
          else {
            if (0x5f < bVar2) {
              bVar15 = bVar2 != 0x60;
              bVar14 = bVar2 < 0x7b;
              goto LAB_00486d63;
            }
            if (bVar2 == 0x5f) goto LAB_0048805a;
          }
          this->TokenType = 0x15c;
        }
        goto LAB_0048807b;
      }
      if (bVar2 < 0x76) {
        if (bVar2 == 0x6c) goto LAB_00484743;
        if (bVar2 != 0x6e) goto switchD_00483261_caseD_4a;
LAB_00483cc6:
        bVar2 = pbVar13[2];
        if ((bVar2 & 0xdf) != 0x55) goto LAB_00485940;
        bVar2 = pbVar13[3];
        if ((bVar2 & 0xdf) != 0x4d) goto LAB_00486716;
        bVar2 = pbVar13[4];
        pbVar11 = pbVar13 + 4;
        if (bVar2 < 0x5b) {
          bVar15 = 0x2f < bVar2;
          bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_0048690b:
          if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
        }
        else {
          if (0x5f < bVar2) {
            bVar15 = bVar2 != 0x60;
            bVar14 = bVar2 < 0x7b;
            goto LAB_0048690b;
          }
          if (bVar2 == 0x5f) goto LAB_0048805a;
        }
        this->TokenType = 0x147;
        goto LAB_0048807b;
      }
      if (bVar2 == 0x76) goto LAB_00484789;
      if (bVar2 != 0x78) goto switchD_00483261_caseD_4a;
LAB_004844ba:
      pbVar11 = pbVar13 + 2;
      bVar2 = pbVar13[2];
      if (bVar2 < 0x55) {
        if (bVar2 < 0x50) {
          if (bVar2 != 0x45) goto switchD_00483261_caseD_4a;
LAB_00485447:
          bVar2 = pbVar13[3];
          if ((bVar2 & 0xdf) != 0x43) goto LAB_00486716;
          bVar2 = pbVar13[4];
          pbVar11 = pbVar13 + 4;
          if (bVar2 < 0x5b) {
            bVar15 = 0x2f < bVar2;
            bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00486d83:
            if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
          }
          else {
            if (0x5f < bVar2) {
              bVar15 = bVar2 != 0x60;
              bVar14 = bVar2 < 0x7b;
              goto LAB_00486d83;
            }
            if (bVar2 == 0x5f) goto LAB_0048805a;
          }
          this->TokenType = 0x156;
          goto LAB_0048807b;
        }
        if (bVar2 != 0x50) {
          if (bVar2 != 0x54) goto switchD_00483261_caseD_4a;
          goto LAB_00485e4a;
        }
LAB_0048615f:
        bVar2 = pbVar13[3];
        if ((bVar2 & 0xdf) != 0x4f) goto LAB_00486716;
        bVar2 = pbVar13[4];
        if ((bVar2 & 0xdf) != 0x52) goto LAB_0048719a;
        bVar2 = pbVar13[5];
        if ((bVar2 & 0xdf) != 0x54) goto LAB_00487277;
        bVar2 = pbVar13[6];
        pbVar11 = pbVar13 + 6;
        if (bVar2 < 0x5b) {
          bVar15 = 0x2f < bVar2;
          bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00487771:
          if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
        }
        else {
          if (0x5f < bVar2) {
            bVar15 = bVar2 != 0x60;
            bVar14 = bVar2 < 0x7b;
            goto LAB_00487771;
          }
          if (bVar2 == 0x5f) goto LAB_0048805a;
        }
        this->TokenType = 0x170;
        goto LAB_0048807b;
      }
      if (bVar2 < 0x70) {
        if (bVar2 != 0x65) goto switchD_00483261_caseD_4a;
        goto LAB_00485447;
      }
      if (bVar2 == 0x70) goto LAB_0048615f;
      if (bVar2 != 0x74) goto switchD_00483261_caseD_4a;
LAB_00485e4a:
      bVar2 = pbVar13[3];
      if ((bVar2 & 0xdf) != 0x45) goto LAB_00486716;
      bVar2 = pbVar13[4];
      if ((bVar2 & 0xdf) != 0x4e) goto LAB_0048719a;
      bVar2 = pbVar13[5];
      if ((bVar2 & 0xdf) != 0x44) goto LAB_00487277;
      bVar2 = pbVar13[6];
      pbVar11 = pbVar13 + 6;
      if (bVar2 < 0x5b) {
        bVar15 = 0x2f < bVar2;
        bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00487751:
        if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
      }
      else {
        if (0x5f < bVar2) {
          bVar15 = bVar2 != 0x60;
          bVar14 = bVar2 < 0x7b;
          goto LAB_00487751;
        }
        if (bVar2 == 0x5f) goto LAB_0048805a;
      }
      this->TokenType = 0x162;
      goto LAB_0048807b;
    case 0x46:
    case 0x66:
      pbVar11 = pbVar13 + 1;
      bVar2 = pbVar13[1];
      if (0x4f < bVar2) {
        if (bVar2 < 0x6a) {
          if (bVar2 == 0x61) goto LAB_00484b58;
          if (bVar2 != 0x69) goto switchD_00483261_caseD_4a;
LAB_00483b4a:
          bVar2 = pbVar13[2];
          if ((bVar2 & 0xdf) != 0x4e) goto LAB_00485940;
          bVar2 = pbVar13[3];
          if ((bVar2 & 0xdf) != 0x41) goto LAB_00486716;
          bVar2 = pbVar13[4];
          if ((bVar2 & 0xdf) != 0x4c) goto LAB_0048719a;
          bVar2 = pbVar13[5];
          pbVar11 = pbVar13 + 5;
          if (bVar2 < 0x5b) {
            bVar15 = 0x2f < bVar2;
            bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00486f80:
            if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
          }
          else {
            if (0x5f < bVar2) {
              bVar15 = bVar2 != 0x60;
              bVar14 = bVar2 < 0x7b;
              goto LAB_00486f80;
            }
            if (bVar2 == 0x5f) goto LAB_0048805a;
          }
          this->TokenType = 0x160;
          goto LAB_0048807b;
        }
        if (bVar2 < 0x6d) {
          if (bVar2 != 0x6c) goto switchD_00483261_caseD_4a;
          goto LAB_004843a0;
        }
        if (bVar2 != 0x6f) goto switchD_00483261_caseD_4a;
LAB_004851ec:
        bVar2 = pbVar13[2];
        if ((bVar2 & 0xdf) != 0x52) goto LAB_00485940;
        pbVar11 = pbVar13 + 3;
        bVar2 = pbVar13[3];
        if (bVar2 < 0x5b) {
          if (0x40 < bVar2) {
            if (bVar2 != 0x45) goto LAB_0048805a;
LAB_00486766:
            bVar2 = pbVar13[4];
            if ((bVar2 & 0xdf) != 0x41) goto LAB_0048719a;
            bVar2 = pbVar13[5];
            if ((bVar2 & 0xdf) != 0x43) goto LAB_00487277;
            bVar2 = pbVar13[6];
            if ((bVar2 & 0xdf) != 0x48) goto LAB_004871a3;
            bVar2 = pbVar13[7];
            pbVar11 = pbVar13 + 7;
            if (bVar2 < 0x5b) {
              bVar15 = 0x2f < bVar2;
              bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00487a7f:
              if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
            }
            else {
              if (0x5f < bVar2) {
                bVar15 = bVar2 != 0x60;
                bVar14 = bVar2 < 0x7b;
                goto LAB_00487a7f;
              }
              if (bVar2 == 0x5f) goto LAB_0048805a;
            }
            this->TokenType = 0x14f;
            goto LAB_0048807b;
          }
          if ((byte)(bVar2 - 0x30) < 10) goto LAB_0048805a;
        }
        else if (bVar2 < 0x61) {
          if (bVar2 == 0x5f) goto LAB_0048805a;
        }
        else {
          if (bVar2 == 0x65) goto LAB_00486766;
          if (bVar2 < 0x7b) goto LAB_0048805a;
        }
        this->TokenType = 0x12d;
        goto LAB_0048807b;
      }
      if (0x49 < bVar2) {
        if (bVar2 != 0x4c) {
          if (bVar2 != 0x4f) goto switchD_00483261_caseD_4a;
          goto LAB_004851ec;
        }
LAB_004843a0:
        bVar2 = pbVar13[2];
        if ((bVar2 & 0xdf) != 0x4f) goto LAB_00485940;
        bVar2 = pbVar13[3];
        if ((bVar2 & 0xdf) != 0x41) goto LAB_00486716;
        bVar2 = pbVar13[4];
        if ((bVar2 & 0xdf) != 0x54) goto LAB_0048719a;
        bVar2 = pbVar13[5];
        pbVar11 = pbVar13 + 5;
        if (bVar2 < 0x5b) {
          bVar15 = 0x2f < bVar2;
          bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_0048706b:
          if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
        }
        else {
          if (0x5f < bVar2) {
            bVar15 = bVar2 != 0x60;
            bVar14 = bVar2 < 0x7b;
            goto LAB_0048706b;
          }
          if (bVar2 == 0x5f) goto LAB_0048805a;
        }
        this->TokenType = 0x134;
        goto LAB_0048807b;
      }
      if (bVar2 != 0x41) {
        if (bVar2 != 0x49) goto switchD_00483261_caseD_4a;
        goto LAB_00483b4a;
      }
LAB_00484b58:
      pbVar11 = pbVar13 + 2;
      bVar2 = pbVar13[2];
      if (bVar2 < 0x54) {
        if (bVar2 == 0x4c) {
LAB_00485722:
          bVar2 = pbVar13[3];
          if ((bVar2 & 0xdf) != 0x53) goto LAB_00486716;
          bVar2 = pbVar13[4];
          if ((bVar2 & 0xdf) != 0x45) goto LAB_0048719a;
          bVar2 = pbVar13[5];
          pbVar11 = pbVar13 + 5;
          if (bVar2 < 0x5b) {
            bVar15 = 0x2f < bVar2;
            bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00487339:
            if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
          }
          else {
            if (0x5f < bVar2) {
              bVar15 = bVar2 != 0x60;
              bVar14 = bVar2 < 0x7b;
              goto LAB_00487339;
            }
            if (bVar2 == 0x5f) goto LAB_0048805a;
          }
          this->TokenType = 0x151;
          goto LAB_0048807b;
        }
        if (bVar2 != 0x53) goto switchD_00483261_caseD_4a;
      }
      else {
        if (bVar2 < 0x6d) {
          if (bVar2 != 0x6c) goto switchD_00483261_caseD_4a;
          goto LAB_00485722;
        }
        if (bVar2 != 0x73) goto switchD_00483261_caseD_4a;
      }
      bVar2 = pbVar13[3];
      if ((bVar2 & 0xdf) != 0x54) goto LAB_00486716;
      bVar2 = pbVar13[4];
      pbVar11 = pbVar13 + 4;
      if (bVar2 < 0x5b) {
        bVar15 = 0x2f < bVar2;
        bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00486e93:
        if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
      }
      else {
        if (0x5f < bVar2) {
          bVar15 = bVar2 != 0x60;
          bVar14 = bVar2 < 0x7b;
          goto LAB_00486e93;
        }
        if (bVar2 == 0x5f) goto LAB_0048805a;
      }
      bVar15 = this->StateOptions == false;
      iVar3 = 0x189;
      break;
    case 0x47:
    case 0x67:
      pbVar11 = pbVar13 + 1;
      bVar2 = pbVar13[1];
      if (bVar2 < 0x50) {
        if (bVar2 == 0x4c) {
LAB_004838a9:
          bVar2 = pbVar13[2];
          if ((bVar2 & 0xdf) != 0x4f) goto LAB_00485940;
          bVar2 = pbVar13[3];
          if ((bVar2 & 0xdf) != 0x42) goto LAB_00486716;
          bVar2 = pbVar13[4];
          if ((bVar2 & 0xdf) != 0x41) goto LAB_0048719a;
          bVar2 = pbVar13[5];
          if ((bVar2 & 0xdf) != 0x4c) goto LAB_00487277;
          bVar2 = pbVar13[6];
          pbVar11 = pbVar13 + 6;
          if (bVar2 < 0x5b) {
            bVar15 = 0x2f < bVar2;
            bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_0048702b:
            if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
          }
          else {
            if (0x5f < bVar2) {
              bVar15 = bVar2 != 0x60;
              bVar14 = bVar2 < 0x7b;
              goto LAB_0048702b;
            }
            if (bVar2 == 0x5f) goto LAB_0048805a;
          }
          this->TokenType = 0x175;
          goto LAB_0048807b;
        }
        if (bVar2 != 0x4f) goto switchD_00483261_caseD_4a;
      }
      else {
        if (bVar2 < 0x6d) {
          if (bVar2 != 0x6c) goto switchD_00483261_caseD_4a;
          goto LAB_004838a9;
        }
        if (bVar2 != 0x6f) goto switchD_00483261_caseD_4a;
      }
      bVar2 = pbVar13[2];
      if ((bVar2 & 0xdf) != 0x54) goto LAB_00485940;
      bVar2 = pbVar13[3];
      if ((bVar2 & 0xdf) != 0x4f) goto LAB_00486716;
      bVar2 = pbVar13[4];
      pbVar11 = pbVar13 + 4;
      if (bVar2 < 0x5b) {
        bVar15 = 0x2f < bVar2;
        bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00486728:
        if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
      }
      else {
        if (0x5f < bVar2) {
          bVar15 = bVar2 != 0x60;
          bVar14 = bVar2 < 0x7b;
          goto LAB_00486728;
        }
        if (bVar2 == 0x5f) goto LAB_0048805a;
      }
      this->TokenType = 0x14d;
      goto LAB_0048807b;
    case 0x48:
    case 0x4a:
    case 0x4b:
    case 0x51:
    case 0x58:
    case 0x59:
    case 0x5a:
    case 0x5f:
    case 0x68:
    case 0x6a:
    case 0x6b:
    case 0x71:
    case 0x78:
    case 0x79:
    case 0x7a:
switchD_0048294f_caseD_48:
      pbVar11 = pbVar13;
      goto LAB_0048805a;
    case 0x49:
    case 0x69:
      pbVar11 = pbVar13 + 1;
      bVar2 = pbVar13[1];
      if (0x53 < bVar2) {
        if (bVar2 < 0x6e) {
          if (bVar2 != 0x66) goto switchD_00483261_caseD_4a;
LAB_00483923:
          bVar2 = pbVar13[2];
          pbVar13 = pbVar13 + 2;
          if (bVar2 < 0x5b) {
            bVar15 = 0x2f < bVar2;
            bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00485d3b:
            if ((bool)(bVar15 & bVar14)) goto switchD_0048294f_caseD_48;
          }
          else {
            if (0x5f < bVar2) {
              bVar15 = bVar2 != 0x60;
              bVar14 = bVar2 < 0x7b;
              goto LAB_00485d3b;
            }
            if (bVar2 == 0x5f) goto switchD_0048294f_caseD_48;
          }
          this->TokenType = 0x12e;
        }
        else {
          if (bVar2 == 0x6e) goto LAB_00484b06;
          if (bVar2 != 0x73) goto switchD_00483261_caseD_4a;
LAB_004842b7:
          bVar2 = pbVar13[2];
          pbVar13 = pbVar13 + 2;
          if (bVar2 < 0x5b) {
            bVar15 = 0x2f < bVar2;
            bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00485f51:
            if ((bool)(bVar15 & bVar14)) goto switchD_0048294f_caseD_48;
          }
          else {
            if (0x5f < bVar2) {
              bVar15 = bVar2 != 0x60;
              bVar14 = bVar2 < 0x7b;
              goto LAB_00485f51;
            }
            if (bVar2 == 0x5f) goto switchD_0048294f_caseD_48;
          }
          this->TokenType = 0x178;
        }
        goto LAB_004869b2;
      }
      if (bVar2 < 0x4e) {
        if (bVar2 != 0x46) goto switchD_00483261_caseD_4a;
        goto LAB_00483923;
      }
      if (bVar2 != 0x4e) {
        if (bVar2 != 0x53) goto switchD_00483261_caseD_4a;
        goto LAB_004842b7;
      }
LAB_00484b06:
      pbVar11 = pbVar13 + 2;
      bVar2 = pbVar13[2];
      if (bVar2 < 0x5b) {
        if (0x40 < bVar2) {
          if (bVar2 < 0x53) goto LAB_0048805a;
          if (bVar2 == 0x53) {
LAB_00485f8a:
            bVar2 = pbVar13[3];
            if ((bVar2 & 0xdf) != 0x54) goto LAB_00486716;
            bVar2 = pbVar13[4];
            if ((bVar2 & 0xdf) != 0x41) goto LAB_0048719a;
            bVar2 = pbVar13[5];
            if ((bVar2 & 0xdf) != 0x4e) goto LAB_00487277;
            bVar2 = pbVar13[6];
            if ((bVar2 & 0xdf) != 0x43) goto LAB_004871a3;
            bVar2 = pbVar13[7];
            if ((bVar2 & 0xdf) != 0x45) goto LAB_004871a9;
            bVar2 = pbVar13[8];
            if ((bVar2 & 0xdf) != 0x4f) goto LAB_004876ee;
            bVar2 = pbVar13[9];
            if ((bVar2 & 0xdf) != 0x46) goto LAB_0048773f;
            bVar2 = pbVar13[10];
            pbVar11 = pbVar13 + 10;
            if (bVar2 < 0x5b) {
              bVar15 = 0x2f < bVar2;
              bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00487dae:
              if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
            }
            else {
              if (0x5f < bVar2) {
                bVar15 = bVar2 != 0x60;
                bVar14 = bVar2 < 0x7b;
                goto LAB_00487dae;
              }
              if (bVar2 == 0x5f) goto LAB_0048805a;
            }
            this->TokenType = 0x154;
          }
          else {
            if (0x54 < bVar2) goto LAB_0048805a;
LAB_00486616:
            pbVar11 = pbVar13 + 3;
            bVar2 = pbVar13[3];
            if (0x39 < bVar2) {
              if (bVar2 < 0x5f) {
                if ((byte)(bVar2 + 0xbf) < 0x1a) goto LAB_0048805a;
              }
              else if (bVar2 != 0x60 && bVar2 < 0x7b) goto LAB_0048805a;
LAB_00487120:
              this->TokenType = 0x140;
              goto LAB_0048807b;
            }
            if (0x31 < bVar2) {
              if (bVar2 != 0x38) goto LAB_0048805a;
              bVar2 = pbVar13[4];
              pbVar11 = pbVar13 + 4;
              if (bVar2 < 0x5b) {
                bVar15 = 0x2f < bVar2;
                bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00487b10:
                if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
              }
              else {
                if (0x5f < bVar2) {
                  bVar15 = bVar2 != 0x60;
                  bVar14 = bVar2 < 0x7b;
                  goto LAB_00487b10;
                }
                if (bVar2 == 0x5f) goto LAB_0048805a;
              }
              this->TokenType = 0x13c;
              goto LAB_0048807b;
            }
            if (bVar2 < 0x30) goto LAB_00487120;
            if (bVar2 != 0x31) goto LAB_0048805a;
            bVar2 = pbVar13[4];
            if (bVar2 != 0x36) goto LAB_0048719a;
            bVar2 = pbVar13[5];
            pbVar11 = pbVar13 + 5;
            if (bVar2 < 0x5b) {
              bVar15 = 0x2f < bVar2;
              bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00487d79:
              if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
            }
            else {
              if (0x5f < bVar2) {
                bVar15 = bVar2 != 0x60;
                bVar14 = bVar2 < 0x7b;
                goto LAB_00487d79;
              }
              if (bVar2 == 0x5f) goto LAB_0048805a;
            }
            this->TokenType = 0x13e;
          }
          goto LAB_0048807b;
        }
        if ((byte)(bVar2 - 0x30) < 10) goto LAB_0048805a;
      }
      else if (bVar2 < 0x73) {
        if (0x60 < bVar2 || bVar2 == 0x5f) goto LAB_0048805a;
      }
      else {
        if (bVar2 == 0x73) goto LAB_00485f8a;
        if (bVar2 < 0x75) goto LAB_00486616;
        if (bVar2 < 0x7b) goto LAB_0048805a;
      }
      this->TokenType = 0x17e;
      goto LAB_0048807b;
    case 0x4c:
    case 0x6c:
      pbVar11 = pbVar13 + 1;
      bVar2 = pbVar13[1];
      if (0x4f < bVar2) {
        if (bVar2 < 0x66) {
          if (bVar2 == 0x61) goto LAB_00484ba8;
          if (bVar2 != 0x65) goto switchD_00483261_caseD_4a;
LAB_00483d27:
          bVar2 = pbVar13[2];
          if ((bVar2 & 0xdf) != 0x54) goto LAB_00485940;
          bVar2 = pbVar13[3];
          pbVar11 = pbVar13 + 3;
          if (bVar2 < 0x5b) {
            bVar15 = 0x2f < bVar2;
            bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_004866ae:
            if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
          }
          else {
            if (0x5f < bVar2) {
              bVar15 = bVar2 != 0x60;
              bVar14 = bVar2 < 0x7b;
              goto LAB_004866ae;
            }
            if (bVar2 == 0x5f) goto LAB_0048805a;
          }
          this->TokenType = 399;
          goto LAB_0048807b;
        }
        if (bVar2 < 0x6a) {
          if (bVar2 != 0x69) goto switchD_00483261_caseD_4a;
          goto LAB_00484504;
        }
        if (bVar2 != 0x6f) goto switchD_00483261_caseD_4a;
LAB_00485230:
        pbVar11 = pbVar13 + 2;
        bVar2 = pbVar13[2];
        if (bVar2 < 0x4f) {
          if (bVar2 != 0x43) {
            if (bVar2 != 0x4e) goto switchD_00483261_caseD_4a;
LAB_00486288:
            bVar2 = pbVar13[3];
            if ((bVar2 & 0xdf) != 0x47) goto LAB_00486716;
            bVar2 = pbVar13[4];
            pbVar11 = pbVar13 + 4;
            if (bVar2 < 0x5b) {
              bVar15 = 0x2f < bVar2;
              bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00486f40:
              if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
            }
            else {
              if (0x5f < bVar2) {
                bVar15 = bVar2 != 0x60;
                bVar14 = bVar2 < 0x7b;
                goto LAB_00486f40;
              }
              if (bVar2 == 0x5f) goto LAB_0048805a;
            }
            this->TokenType = 0x142;
            goto LAB_0048807b;
          }
        }
        else {
          if (99 < bVar2) {
            if (bVar2 != 0x6e) goto switchD_00483261_caseD_4a;
            goto LAB_00486288;
          }
          if (bVar2 != 99) goto switchD_00483261_caseD_4a;
        }
        bVar2 = pbVar13[3];
        if ((bVar2 & 0xdf) != 0x41) goto LAB_00486716;
        bVar2 = pbVar13[4];
        if ((bVar2 & 0xdf) != 0x4c) goto LAB_0048719a;
        bVar2 = pbVar13[5];
        if ((bVar2 & 0xdf) != 0x49) goto LAB_00487277;
        bVar2 = pbVar13[6];
        if ((bVar2 & 0xdf) != 0x5a) goto LAB_004871a3;
        bVar2 = pbVar13[7];
        if ((bVar2 & 0xdf) != 0x45) goto LAB_004871a9;
        bVar2 = pbVar13[8];
        if ((bVar2 & 0xdf) != 0x44) goto LAB_004876ee;
        bVar2 = pbVar13[9];
        pbVar11 = pbVar13 + 9;
        if (bVar2 < 0x5b) {
          bVar15 = 0x2f < bVar2;
          bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00487d4d:
          if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
        }
        else {
          if (0x5f < bVar2) {
            bVar15 = bVar2 != 0x60;
            bVar14 = bVar2 < 0x7b;
            goto LAB_00487d4d;
          }
          if (bVar2 == 0x5f) goto LAB_0048805a;
        }
        this->TokenType = 0x169;
        goto LAB_0048807b;
      }
      if (bVar2 < 0x46) {
        if (bVar2 != 0x41) {
          if (bVar2 != 0x45) goto switchD_00483261_caseD_4a;
          goto LAB_00483d27;
        }
LAB_00484ba8:
        bVar2 = pbVar13[2];
        if ((bVar2 & 0xdf) != 0x54) goto LAB_00485940;
        bVar2 = pbVar13[3];
        if ((bVar2 & 0xdf) != 0x45) goto LAB_00486716;
        bVar2 = pbVar13[4];
        if ((bVar2 & 0xdf) != 0x4e) goto LAB_0048719a;
        bVar2 = pbVar13[5];
        if ((bVar2 & 0xdf) != 0x54) goto LAB_00487277;
        bVar2 = pbVar13[6];
        pbVar11 = pbVar13 + 6;
        if (bVar2 < 0x5b) {
          bVar15 = 0x2f < bVar2;
          bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_004873cc:
          if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
        }
        else {
          if (0x5f < bVar2) {
            bVar15 = bVar2 != 0x60;
            bVar14 = bVar2 < 0x7b;
            goto LAB_004873cc;
          }
          if (bVar2 == 0x5f) goto LAB_0048805a;
        }
        this->TokenType = 0x16a;
        goto LAB_0048807b;
      }
      if (bVar2 != 0x49) {
        if (bVar2 != 0x4f) goto switchD_00483261_caseD_4a;
        goto LAB_00485230;
      }
LAB_00484504:
      bVar2 = pbVar13[2];
      if ((bVar2 & 0xdf) != 0x47) goto LAB_00485940;
      bVar2 = pbVar13[3];
      if ((bVar2 & 0xdf) != 0x48) goto LAB_00486716;
      bVar2 = pbVar13[4];
      if ((bVar2 & 0xdf) != 0x54) goto LAB_0048719a;
      bVar2 = pbVar13[5];
      pbVar11 = pbVar13 + 5;
      if (bVar2 < 0x5b) {
        bVar15 = 0x2f < bVar2;
        bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_0048708b:
        if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
      }
      else {
        if (0x5f < bVar2) {
          bVar15 = bVar2 != 0x60;
          bVar14 = bVar2 < 0x7b;
          goto LAB_0048708b;
        }
        if (bVar2 == 0x5f) goto LAB_0048805a;
      }
      bVar15 = this->StateOptions == false;
      iVar3 = 0x18a;
      break;
    case 0x4d:
    case 0x6d:
      pbVar11 = pbVar13 + 1;
      bVar2 = pbVar13[1];
      if (bVar2 < 0x46) {
        if (bVar2 == 0x41) {
LAB_00483d6b:
          bVar2 = pbVar13[2];
          if ((bVar2 & 0xdf) != 0x50) goto LAB_00485940;
          bVar2 = pbVar13[3];
          pbVar11 = pbVar13 + 3;
          if (bVar2 < 0x5b) {
            bVar15 = 0x2f < bVar2;
            bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_004862da:
            if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
          }
          else {
            if (0x5f < bVar2) {
              bVar15 = bVar2 != 0x60;
              bVar14 = bVar2 < 0x7b;
              goto LAB_004862da;
            }
            if (bVar2 == 0x5f) goto LAB_0048805a;
          }
          this->TokenType = 0x17c;
          goto LAB_0048807b;
        }
        if (bVar2 != 0x45) goto switchD_00483261_caseD_4a;
      }
      else {
        if (bVar2 < 0x62) {
          if (bVar2 != 0x61) goto switchD_00483261_caseD_4a;
          goto LAB_00483d6b;
        }
        if (bVar2 != 0x65) goto switchD_00483261_caseD_4a;
      }
      bVar2 = pbVar13[2];
      if ((bVar2 & 0xdf) != 0x54) {
LAB_00485940:
        pbVar11 = pbVar13 + 2;
        goto switchD_00483261_caseD_4a;
      }
      bVar2 = pbVar13[3];
      if ((bVar2 & 0xdf) != 0x41) {
LAB_00486716:
        pbVar11 = pbVar13 + 3;
        goto switchD_00483261_caseD_4a;
      }
      bVar2 = pbVar13[4];
      pbVar11 = pbVar13 + 4;
      if (bVar2 < 0x5b) {
        bVar15 = 0x2f < bVar2;
        bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_004867d4:
        if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
      }
      else {
        if (0x5f < bVar2) {
          bVar15 = bVar2 != 0x60;
          bVar14 = bVar2 < 0x7b;
          goto LAB_004867d4;
        }
        if (bVar2 == 0x5f) goto LAB_0048805a;
      }
      this->TokenType = 0x185;
      goto LAB_0048807b;
    case 0x4e:
    case 0x6e:
      pbVar11 = pbVar13 + 1;
      bVar2 = pbVar13[1];
      if (0x55 < bVar2) {
        if (bVar2 < 0x66) {
          if (bVar2 == 0x61) goto LAB_00484b30;
          if (bVar2 != 0x65) goto switchD_00483261_caseD_4a;
LAB_004839d6:
          bVar2 = pbVar13[2];
          if ((bVar2 & 0xdf) != 0x57) goto LAB_00485940;
          bVar2 = pbVar13[3];
          pbVar11 = pbVar13 + 3;
          if (bVar2 < 0x5b) {
            bVar15 = 0x2f < bVar2;
            bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_0048667a:
            if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
          }
          else {
            if (0x5f < bVar2) {
              bVar15 = bVar2 != 0x60;
              bVar14 = bVar2 < 0x7b;
              goto LAB_0048667a;
            }
            if (bVar2 == 0x5f) goto LAB_0048805a;
          }
          this->TokenType = 0x153;
        }
        else {
          if (bVar2 < 0x70) {
            if (bVar2 != 0x6f) goto switchD_00483261_caseD_4a;
            goto LAB_0048432b;
          }
          if (bVar2 != 0x75) goto switchD_00483261_caseD_4a;
LAB_004850b0:
          bVar2 = pbVar13[2];
          if ((bVar2 & 0xdf) != 0x4c) goto LAB_00485940;
          bVar2 = pbVar13[3];
          if ((bVar2 & 0xdf) != 0x4c) goto LAB_00486716;
          bVar2 = pbVar13[4];
          pbVar11 = pbVar13 + 4;
          if (bVar2 < 0x5b) {
            bVar15 = 0x2f < bVar2;
            bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00486b9b:
            if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
          }
          else {
            if (0x5f < bVar2) {
              bVar15 = bVar2 != 0x60;
              bVar14 = bVar2 < 0x7b;
              goto LAB_00486b9b;
            }
            if (bVar2 == 0x5f) goto LAB_0048805a;
          }
          this->TokenType = 0x174;
        }
        goto LAB_0048807b;
      }
      if (bVar2 < 0x46) {
        if (bVar2 != 0x41) {
          if (bVar2 != 0x45) goto switchD_00483261_caseD_4a;
          goto LAB_004839d6;
        }
LAB_00484b30:
        pbVar11 = pbVar13 + 2;
        bVar2 = pbVar13[2];
        if (bVar2 < 0x55) {
          if (bVar2 == 0x4d) {
LAB_004856de:
            bVar2 = pbVar13[3];
            if ((bVar2 & 0xdf) != 0x45) goto LAB_00486716;
            bVar2 = pbVar13[4];
            pbVar11 = pbVar13 + 4;
            if (bVar2 < 0x5b) {
              bVar15 = 0x2f < bVar2;
              bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00486e73:
              if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
            }
            else {
              if (0x5f < bVar2) {
                bVar15 = bVar2 != 0x60;
                bVar14 = bVar2 < 0x7b;
                goto LAB_00486e73;
              }
              if (bVar2 == 0x5f) goto LAB_0048805a;
            }
            this->TokenType = 0x148;
            goto LAB_0048807b;
          }
          if (bVar2 != 0x54) goto switchD_00483261_caseD_4a;
        }
        else {
          if (bVar2 < 0x6e) {
            if (bVar2 != 0x6d) goto switchD_00483261_caseD_4a;
            goto LAB_004856de;
          }
          if (bVar2 != 0x74) goto switchD_00483261_caseD_4a;
        }
        bVar2 = pbVar13[3];
        if ((bVar2 & 0xdf) != 0x49) goto LAB_00486716;
        bVar2 = pbVar13[4];
        if ((bVar2 & 0xdf) != 0x56) goto LAB_0048719a;
        bVar2 = pbVar13[5];
        if ((bVar2 & 0xdf) != 0x45) goto LAB_00487277;
        bVar2 = pbVar13[6];
        pbVar11 = pbVar13 + 6;
        if (bVar2 < 0x5b) {
          bVar15 = 0x2f < bVar2;
          bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_0048759a:
          if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
        }
        else {
          if (0x5f < bVar2) {
            bVar15 = bVar2 != 0x60;
            bVar14 = bVar2 < 0x7b;
            goto LAB_0048759a;
          }
          if (bVar2 == 0x5f) goto LAB_0048805a;
        }
        this->TokenType = 0x158;
        goto LAB_0048807b;
      }
      if (bVar2 != 0x4f) {
        if (bVar2 != 0x55) goto switchD_00483261_caseD_4a;
        goto LAB_004850b0;
      }
LAB_0048432b:
      pbVar11 = pbVar13 + 2;
      bVar2 = pbVar13[2];
      if (bVar2 < 0x4f) {
        if (bVar2 == 0x44) {
LAB_00485874:
          bVar2 = pbVar13[3];
          if ((bVar2 & 0xdf) != 0x45) goto LAB_00486716;
          bVar2 = pbVar13[4];
          if ((bVar2 & 0xdf) != 0x4c) goto LAB_0048719a;
          bVar2 = pbVar13[5];
          if ((bVar2 & 0xdf) != 0x41) goto LAB_00487277;
          bVar2 = pbVar13[6];
          if ((bVar2 & 0xdf) != 0x59) goto LAB_004871a3;
          bVar2 = pbVar13[7];
          pbVar11 = pbVar13 + 7;
          if (bVar2 < 0x5b) {
            bVar15 = 0x2f < bVar2;
            bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_004879a9:
            if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
          }
          else {
            if (0x5f < bVar2) {
              bVar15 = bVar2 != 0x60;
              bVar14 = bVar2 < 0x7b;
              goto LAB_004879a9;
            }
            if (bVar2 == 0x5f) goto LAB_0048805a;
          }
          bVar15 = this->StateOptions == false;
          iVar3 = 0x18b;
          break;
        }
        if (bVar2 != 0x4e) goto switchD_00483261_caseD_4a;
      }
      else {
        if (bVar2 < 0x65) {
          if (bVar2 != 100) goto switchD_00483261_caseD_4a;
          goto LAB_00485874;
        }
        if (bVar2 != 0x6e) goto switchD_00483261_caseD_4a;
      }
      bVar2 = pbVar13[3];
      if ((bVar2 & 0xdf) != 0x45) goto LAB_00486716;
      bVar2 = pbVar13[4];
      pbVar11 = pbVar13 + 4;
      if (bVar2 < 0x5b) {
        bVar15 = 0x2f < bVar2;
        bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00486f20:
        if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
      }
      else {
        if (0x5f < bVar2) {
          bVar15 = bVar2 != 0x60;
          bVar14 = bVar2 < 0x7b;
          goto LAB_00486f20;
        }
        if (bVar2 == 0x5f) goto LAB_0048805a;
      }
      this->TokenType = 0x152;
      goto LAB_0048807b;
    case 0x4f:
    case 0x6f:
      pbVar11 = pbVar13 + 1;
      bVar2 = pbVar13[1];
      if (0x56 < bVar2) {
        if (bVar2 < 0x71) {
          if (bVar2 != 0x66) {
            if (bVar2 != 0x70) goto switchD_00483261_caseD_4a;
            goto LAB_0048419c;
          }
          goto LAB_004848ce;
        }
        if (bVar2 < 0x75) goto switchD_00483261_caseD_4a;
        if (bVar2 != 0x75) {
          if (0x76 < bVar2) goto switchD_00483261_caseD_4a;
          goto LAB_00485009;
        }
LAB_004854e3:
        bVar2 = pbVar13[2];
        if ((bVar2 & 0xdf) != 0x54) goto LAB_00485940;
        bVar2 = pbVar13[3];
        pbVar11 = pbVar13 + 3;
        if (bVar2 < 0x5b) {
          bVar15 = 0x2f < bVar2;
          bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00486a18:
          if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
        }
        else {
          if (0x5f < bVar2) {
            bVar15 = bVar2 != 0x60;
            bVar14 = bVar2 < 0x7b;
            goto LAB_00486a18;
          }
          if (bVar2 == 0x5f) goto LAB_0048805a;
        }
        this->TokenType = 0x15a;
        goto LAB_0048807b;
      }
      if (bVar2 < 0x50) {
        if (bVar2 != 0x46) goto switchD_00483261_caseD_4a;
LAB_004848ce:
        bVar2 = pbVar13[2];
        if ((bVar2 & 0xdf) != 0x46) goto LAB_00485940;
        bVar2 = pbVar13[3];
        if ((bVar2 & 0xdf) != 0x53) goto LAB_00486716;
        bVar2 = pbVar13[4];
        if ((bVar2 & 0xdf) != 0x45) goto LAB_0048719a;
        bVar2 = pbVar13[5];
        if ((bVar2 & 0xdf) != 0x54) goto LAB_00487277;
        bVar2 = pbVar13[6];
        pbVar11 = pbVar13 + 6;
        if (bVar2 < 0x5b) {
          bVar15 = 0x2f < bVar2;
          bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_004872c0:
          if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
        }
        else {
          if (0x5f < bVar2) {
            bVar15 = bVar2 != 0x60;
            bVar14 = bVar2 < 0x7b;
            goto LAB_004872c0;
          }
          if (bVar2 == 0x5f) goto LAB_0048805a;
        }
        bVar15 = this->StateOptions == false;
        iVar3 = 0x18c;
        break;
      }
      if (bVar2 == 0x50) {
LAB_0048419c:
        bVar2 = pbVar13[2];
        if ((bVar2 & 0xdf) != 0x54) goto LAB_00485940;
        bVar2 = pbVar13[3];
        if ((bVar2 & 0xdf) != 0x49) goto LAB_00486716;
        bVar2 = pbVar13[4];
        if ((bVar2 & 0xdf) != 0x4f) goto LAB_0048719a;
        bVar2 = pbVar13[5];
        if ((bVar2 & 0xdf) != 0x4e) goto LAB_00487277;
        bVar2 = pbVar13[6];
        if ((bVar2 & 0xdf) != 0x41) goto LAB_004871a3;
        bVar2 = pbVar13[7];
        if ((bVar2 & 0xdf) != 0x4c) goto LAB_004871a9;
        bVar2 = pbVar13[8];
        pbVar11 = pbVar13 + 8;
        if (bVar2 < 0x5b) {
          bVar15 = 0x2f < bVar2;
          bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_004878e5:
          if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
        }
        else {
          if (0x5f < bVar2) {
            bVar15 = bVar2 != 0x60;
            bVar14 = bVar2 < 0x7b;
            goto LAB_004878e5;
          }
          if (bVar2 == 0x5f) goto LAB_0048805a;
        }
        this->TokenType = 0x16f;
      }
      else {
        if (bVar2 < 0x55) goto switchD_00483261_caseD_4a;
        if (bVar2 != 0x56) goto LAB_004854e3;
LAB_00485009:
        bVar2 = pbVar13[2];
        if ((bVar2 & 0xdf) != 0x45) goto LAB_00485940;
        bVar2 = pbVar13[3];
        if ((bVar2 & 0xdf) != 0x52) goto LAB_00486716;
        bVar2 = pbVar13[4];
        if ((bVar2 & 0xdf) != 0x52) goto LAB_0048719a;
        bVar2 = pbVar13[5];
        if ((bVar2 & 0xdf) != 0x49) goto LAB_00487277;
        bVar2 = pbVar13[6];
        if ((bVar2 & 0xdf) != 0x44) goto LAB_004871a3;
        bVar2 = pbVar13[7];
        if ((bVar2 & 0xdf) != 0x45) goto LAB_004871a9;
        bVar2 = pbVar13[8];
        pbVar11 = pbVar13 + 8;
        if (bVar2 < 0x5b) {
          bVar15 = 0x2f < bVar2;
          bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00487cfc:
          if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
        }
        else {
          if (0x5f < bVar2) {
            bVar15 = bVar2 != 0x60;
            bVar14 = bVar2 < 0x7b;
            goto LAB_00487cfc;
          }
          if (bVar2 == 0x5f) goto LAB_0048805a;
        }
        this->TokenType = 0x172;
      }
      goto LAB_0048807b;
    case 0x50:
    case 0x70:
      pbVar11 = pbVar13 + 1;
      bVar2 = pbVar13[1];
      if (bVar2 < 0x56) {
        if (bVar2 != 0x52) {
          if (bVar2 != 0x55) goto switchD_00483261_caseD_4a;
LAB_004846db:
          bVar2 = pbVar13[2];
          if ((bVar2 & 0xdf) != 0x42) goto LAB_00485940;
          bVar2 = pbVar13[3];
          if ((bVar2 & 0xdf) != 0x4c) goto LAB_00486716;
          bVar2 = pbVar13[4];
          if ((bVar2 & 0xdf) != 0x49) goto LAB_0048719a;
          bVar2 = pbVar13[5];
          if ((bVar2 & 0xdf) != 0x43) goto LAB_00487277;
          bVar2 = pbVar13[6];
          pbVar11 = pbVar13 + 6;
          if (bVar2 < 0x5b) {
            bVar15 = 0x2f < bVar2;
            bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_004870b0:
            if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
          }
          else {
            if (0x5f < bVar2) {
              bVar15 = bVar2 != 0x60;
              bVar14 = bVar2 < 0x7b;
              goto LAB_004870b0;
            }
            if (bVar2 == 0x5f) goto LAB_0048805a;
          }
          this->TokenType = 0x163;
          goto LAB_0048807b;
        }
      }
      else {
        if (0x72 < bVar2) {
          if (bVar2 != 0x75) goto switchD_00483261_caseD_4a;
          goto LAB_004846db;
        }
        if (bVar2 != 0x72) goto switchD_00483261_caseD_4a;
      }
      pbVar11 = pbVar13 + 2;
      bVar2 = pbVar13[2];
      if (bVar2 < 0x50) {
        if (bVar2 == 0x49) {
LAB_00484db4:
          bVar2 = pbVar13[3];
          if ((bVar2 & 0xdf) != 0x56) goto LAB_00486716;
          bVar2 = pbVar13[4];
          if ((bVar2 & 0xdf) != 0x41) goto LAB_0048719a;
          bVar2 = pbVar13[5];
          if ((bVar2 & 0xdf) != 0x54) goto LAB_00487277;
          bVar2 = pbVar13[6];
          if ((bVar2 & 0xdf) != 0x45) goto LAB_004871a3;
          bVar2 = pbVar13[7];
          pbVar11 = pbVar13 + 7;
          if (bVar2 < 0x5b) {
            bVar15 = 0x2f < bVar2;
            bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00487700:
            if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
          }
          else {
            if (0x5f < bVar2) {
              bVar15 = bVar2 != 0x60;
              bVar14 = bVar2 < 0x7b;
              goto LAB_00487700;
            }
            if (bVar2 == 0x5f) goto LAB_0048805a;
          }
          this->TokenType = 0x165;
          goto LAB_0048807b;
        }
        if (bVar2 != 0x4f) goto switchD_00483261_caseD_4a;
      }
      else {
        if (bVar2 < 0x6a) {
          if (bVar2 != 0x69) goto switchD_00483261_caseD_4a;
          goto LAB_00484db4;
        }
        if (bVar2 != 0x6f) goto switchD_00483261_caseD_4a;
      }
      bVar2 = pbVar13[3];
      if ((bVar2 & 0xdf) != 0x54) goto LAB_00486716;
      bVar2 = pbVar13[4];
      if ((bVar2 & 0xdf) != 0x45) goto LAB_0048719a;
      bVar2 = pbVar13[5];
      if ((bVar2 & 0xdf) != 0x43) goto LAB_00487277;
      bVar2 = pbVar13[6];
      if ((bVar2 & 0xdf) != 0x54) goto LAB_004871a3;
      bVar2 = pbVar13[7];
      if ((bVar2 & 0xdf) != 0x45) goto LAB_004871a9;
      bVar2 = pbVar13[8];
      if ((bVar2 & 0xdf) != 0x44) goto LAB_004876ee;
      bVar2 = pbVar13[9];
      pbVar11 = pbVar13 + 9;
      if (bVar2 < 0x5b) {
        bVar15 = 0x2f < bVar2;
        bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00487c68:
        if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
      }
      else {
        if (0x5f < bVar2) {
          bVar15 = bVar2 != 0x60;
          bVar14 = bVar2 < 0x7b;
          goto LAB_00487c68;
        }
        if (bVar2 == 0x5f) goto LAB_0048805a;
      }
      this->TokenType = 0x164;
      goto LAB_0048807b;
    case 0x52:
    case 0x72:
      bVar2 = pbVar13[1];
      if ((bVar2 & 0xdf) != 0x45) {
LAB_004833e8:
        pbVar11 = pbVar13 + 1;
        goto switchD_00483261_caseD_4a;
      }
      pbVar11 = pbVar13 + 2;
      bVar2 = pbVar13[2];
      if (0x54 < bVar2) {
        if (bVar2 < 0x67) {
          if (bVar2 == 0x61) goto LAB_00485619;
          if (bVar2 != 0x66) goto switchD_00483261_caseD_4a;
LAB_00484172:
          bVar2 = pbVar13[3];
          pbVar13 = pbVar13 + 3;
          if (bVar2 < 0x5b) {
            bVar15 = 0x2f < bVar2;
            bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_004865f6:
            if ((bool)(bVar15 & bVar14)) goto switchD_0048294f_caseD_48;
          }
          else {
            if (0x5f < bVar2) {
              bVar15 = bVar2 != 0x60;
              bVar14 = bVar2 < 0x7b;
              goto LAB_004865f6;
            }
            if (bVar2 == 0x5f) goto switchD_0048294f_caseD_48;
          }
          this->TokenType = 0x15b;
          goto LAB_004869b2;
        }
        if (bVar2 < 0x71) {
          if (bVar2 != 0x70) goto switchD_00483261_caseD_4a;
          goto LAB_00484f7e;
        }
        if (bVar2 != 0x74) goto switchD_00483261_caseD_4a;
LAB_00485cdb:
        bVar2 = pbVar13[3];
        if ((bVar2 & 0xdf) != 0x55) goto LAB_00486716;
        bVar2 = pbVar13[4];
        if ((bVar2 & 0xdf) != 0x52) goto LAB_0048719a;
        bVar2 = pbVar13[5];
        if ((bVar2 & 0xdf) != 0x4e) goto LAB_00487277;
        bVar2 = pbVar13[6];
        pbVar11 = pbVar13 + 6;
        if (bVar2 < 0x5b) {
          bVar15 = 0x2f < bVar2;
          bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00487461:
          if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
        }
        else {
          if (0x5f < bVar2) {
            bVar15 = bVar2 != 0x60;
            bVar14 = bVar2 < 0x7b;
            goto LAB_00487461;
          }
          if (bVar2 == 0x5f) goto LAB_0048805a;
        }
        this->TokenType = 0x12f;
        goto LAB_0048807b;
      }
      if (bVar2 < 0x47) {
        if (bVar2 != 0x41) {
          if (bVar2 != 0x46) goto switchD_00483261_caseD_4a;
          goto LAB_00484172;
        }
LAB_00485619:
        bVar2 = pbVar13[3];
        if ((bVar2 & 0xdf) != 0x44) goto LAB_00486716;
        bVar2 = pbVar13[4];
        if ((bVar2 & 0xdf) != 0x4f) goto LAB_0048719a;
        bVar2 = pbVar13[5];
        if ((bVar2 & 0xdf) != 0x4e) goto LAB_00487277;
        bVar2 = pbVar13[6];
        if ((bVar2 & 0xdf) != 0x4c) goto LAB_004871a3;
        bVar2 = pbVar13[7];
        if ((bVar2 & 0xdf) != 0x59) goto LAB_004871a9;
        bVar2 = pbVar13[8];
        pbVar11 = pbVar13 + 8;
        if (bVar2 < 0x5b) {
          bVar15 = 0x2f < bVar2;
          bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00487a0b:
          if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
        }
        else {
          if (0x5f < bVar2) {
            bVar15 = bVar2 != 0x60;
            bVar14 = bVar2 < 0x7b;
            goto LAB_00487a0b;
          }
          if (bVar2 == 0x5f) goto LAB_0048805a;
        }
        this->TokenType = 0x187;
      }
      else {
        if (bVar2 != 0x50) {
          if (bVar2 != 0x54) goto switchD_00483261_caseD_4a;
          goto LAB_00485cdb;
        }
LAB_00484f7e:
        bVar2 = pbVar13[3];
        if ((bVar2 & 0xdf) != 0x4c) goto LAB_00486716;
        bVar2 = pbVar13[4];
        if ((bVar2 & 0xdf) != 0x41) goto LAB_0048719a;
        bVar2 = pbVar13[5];
        if ((bVar2 & 0xdf) != 0x43) goto LAB_00487277;
        bVar2 = pbVar13[6];
        if ((bVar2 & 0xdf) != 0x45) goto LAB_004871a3;
        bVar2 = pbVar13[7];
        if ((bVar2 & 0xdf) != 0x53) goto LAB_004871a9;
        bVar2 = pbVar13[8];
        pbVar11 = pbVar13 + 8;
        if (bVar2 < 0x5b) {
          bVar15 = 0x2f < bVar2;
          bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00487a5f:
          if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
        }
        else {
          if (0x5f < bVar2) {
            bVar15 = bVar2 != 0x60;
            bVar14 = bVar2 < 0x7b;
            goto LAB_00487a5f;
          }
          if (bVar2 == 0x5f) goto LAB_0048805a;
        }
        this->TokenType = 0x179;
      }
      goto LAB_0048807b;
    case 0x53:
    case 0x73:
      pbVar11 = pbVar13 + 1;
      bVar2 = pbVar13[1];
      if (0x61 < bVar2) {
        switch(bVar2) {
        case 0x68:
          goto switchD_00483261_caseD_48;
        case 0x69:
          goto switchD_00483261_caseD_49;
        case 0x6a:
        case 0x6b:
        case 0x6d:
        case 0x6e:
        case 0x70:
        case 0x71:
        case 0x72:
        case 0x73:
        case 0x76:
          goto switchD_00483261_caseD_4a;
        case 0x6c:
          goto switchD_00483261_caseD_4c;
        case 0x6f:
          goto switchD_00483261_caseD_4f;
        case 0x74:
          goto switchD_00483261_caseD_54;
        case 0x75:
          goto switchD_00483261_caseD_55;
        case 0x77:
          goto switchD_00483261_caseD_57;
        default:
          if (bVar2 != 0x62) goto switchD_00483261_caseD_4a;
          goto LAB_004857d0;
        }
      }
      switch(bVar2) {
      case 0x48:
switchD_00483261_caseD_48:
        bVar2 = pbVar13[2];
        if ((bVar2 & 0xdf) != 0x4f) goto LAB_00485940;
        bVar2 = pbVar13[3];
        if ((bVar2 & 0xdf) != 0x52) goto LAB_00486716;
        bVar2 = pbVar13[4];
        if ((bVar2 & 0xdf) != 0x54) goto LAB_0048719a;
        bVar2 = pbVar13[5];
        pbVar11 = pbVar13 + 5;
        if (bVar2 < 0x5b) {
          bVar15 = 0x2f < bVar2;
          bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00487226:
          if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
        }
        else {
          if (0x5f < bVar2) {
            bVar15 = bVar2 != 0x60;
            bVar14 = bVar2 < 0x7b;
            goto LAB_00487226;
          }
          if (bVar2 == 0x5f) goto LAB_0048805a;
        }
        this->TokenType = 0x13a;
        goto LAB_0048807b;
      case 0x49:
switchD_00483261_caseD_49:
        pbVar11 = pbVar13 + 2;
        bVar2 = pbVar13[2];
        if (bVar2 < 0x5b) {
          if (bVar2 == 0x4e) {
LAB_00485d61:
            bVar2 = pbVar13[3];
            if ((bVar2 & 0xdf) != 0x47) goto LAB_00486716;
            bVar2 = pbVar13[4];
            if ((bVar2 & 0xdf) != 0x55) goto LAB_0048719a;
            bVar2 = pbVar13[5];
            if ((bVar2 & 0xdf) != 0x4c) goto LAB_00487277;
            bVar2 = pbVar13[6];
            if ((bVar2 & 0xdf) != 0x41) goto LAB_004871a3;
            bVar2 = pbVar13[7];
            if ((bVar2 & 0xdf) != 0x52) goto LAB_004871a9;
            bVar2 = pbVar13[8];
            pbVar11 = pbVar13 + 8;
            if (bVar2 < 0x5b) {
              bVar15 = 0x2f < bVar2;
              bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00487ca8:
              if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
            }
            else {
              if (0x5f < bVar2) {
                bVar15 = bVar2 != 0x60;
                bVar14 = bVar2 < 0x7b;
                goto LAB_00487ca8;
              }
              if (bVar2 == 0x5f) goto LAB_0048805a;
            }
            this->TokenType = 0x16b;
            goto LAB_0048807b;
          }
          if (bVar2 != 0x5a) goto switchD_00483261_caseD_4a;
        }
        else {
          if (bVar2 < 0x6f) {
            if (bVar2 != 0x6e) goto switchD_00483261_caseD_4a;
            goto LAB_00485d61;
          }
          if (bVar2 != 0x7a) goto switchD_00483261_caseD_4a;
        }
        bVar2 = pbVar13[3];
        if ((bVar2 & 0xdf) != 0x45) goto LAB_00486716;
        bVar2 = pbVar13[4];
        if ((bVar2 & 0xdf) != 0x4f) goto LAB_0048719a;
        bVar2 = pbVar13[5];
        if ((bVar2 & 0xdf) != 0x46) goto LAB_00487277;
        bVar2 = pbVar13[6];
        pbVar11 = pbVar13 + 6;
        if (bVar2 < 0x5b) {
          bVar15 = 0x2f < bVar2;
          bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_004877f9:
          if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
        }
        else {
          if (0x5f < bVar2) {
            bVar15 = bVar2 != 0x60;
            bVar14 = bVar2 < 0x7b;
            goto LAB_004877f9;
          }
          if (bVar2 == 0x5f) goto LAB_0048805a;
        }
        this->TokenType = 0x17f;
        goto LAB_0048807b;
      case 0x4a:
      case 0x4b:
      case 0x4d:
      case 0x4e:
      case 0x50:
      case 0x51:
      case 0x52:
      case 0x53:
      case 0x56:
        goto switchD_00483261_caseD_4a;
      case 0x4c:
switchD_00483261_caseD_4c:
        bVar2 = pbVar13[2];
        if ((bVar2 & 0xdf) != 0x4f) goto LAB_00485940;
        bVar2 = pbVar13[3];
        if ((bVar2 & 0xdf) != 0x57) goto LAB_00486716;
        bVar2 = pbVar13[4];
        pbVar11 = pbVar13 + 4;
        if (bVar2 < 0x5b) {
          bVar15 = 0x2f < bVar2;
          bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00486cf7:
          if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
        }
        else {
          if (0x5f < bVar2) {
            bVar15 = bVar2 != 0x60;
            bVar14 = bVar2 < 0x7b;
            goto LAB_00486cf7;
          }
          if (bVar2 == 0x5f) goto LAB_0048805a;
        }
        bVar15 = this->StateOptions == false;
        iVar3 = 0x18d;
        break;
      case 0x4f:
switchD_00483261_caseD_4f:
        bVar2 = pbVar13[2];
        if ((bVar2 & 0xdf) != 0x55) goto LAB_00485940;
        bVar2 = pbVar13[3];
        if ((bVar2 & 0xdf) != 0x4e) goto LAB_00486716;
        bVar2 = pbVar13[4];
        if ((bVar2 & 0xdf) != 0x44) goto LAB_0048719a;
        bVar2 = pbVar13[5];
        pbVar11 = pbVar13 + 5;
        if (bVar2 < 0x5b) {
          bVar15 = 0x2f < bVar2;
          bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00487206:
          if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
        }
        else {
          if (0x5f < bVar2) {
            bVar15 = bVar2 != 0x60;
            bVar14 = bVar2 < 0x7b;
            goto LAB_00487206;
          }
          if (bVar2 == 0x5f) goto LAB_0048805a;
        }
        this->TokenType = 0x14a;
        goto LAB_0048807b;
      case 0x54:
        goto switchD_00483261_caseD_54;
      case 0x55:
switchD_00483261_caseD_55:
        bVar2 = pbVar13[2];
        if ((bVar2 & 0xdf) != 0x50) goto LAB_00485940;
        bVar2 = pbVar13[3];
        if ((bVar2 & 0xdf) != 0x45) goto LAB_00486716;
        bVar2 = pbVar13[4];
        if ((bVar2 & 0xdf) != 0x52) goto LAB_0048719a;
        bVar2 = pbVar13[5];
        pbVar11 = pbVar13 + 5;
        if (bVar2 < 0x5b) {
          bVar15 = 0x2f < bVar2;
          bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_004871e6:
          if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
        }
        else {
          if (0x5f < bVar2) {
            bVar15 = bVar2 != 0x60;
            bVar14 = bVar2 < 0x7b;
            goto LAB_004871e6;
          }
          if (bVar2 == 0x5f) goto LAB_0048805a;
        }
        this->TokenType = 0x173;
        goto LAB_0048807b;
      case 0x57:
switchD_00483261_caseD_57:
        bVar2 = pbVar13[2];
        if ((bVar2 & 0xdf) != 0x49) goto LAB_00485940;
        bVar2 = pbVar13[3];
        if ((bVar2 & 0xdf) != 0x54) goto LAB_00486716;
        bVar2 = pbVar13[4];
        if ((bVar2 & 0xdf) != 0x43) goto LAB_0048719a;
        bVar2 = pbVar13[5];
        if ((bVar2 & 0xdf) != 0x48) goto LAB_00487277;
        bVar2 = pbVar13[6];
        pbVar11 = pbVar13 + 6;
        if (bVar2 < 0x5b) {
          bVar15 = 0x2f < bVar2;
          bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_004874f4:
          if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
        }
        else {
          if (0x5f < bVar2) {
            bVar15 = bVar2 != 0x60;
            bVar14 = bVar2 < 0x7b;
            goto LAB_004874f4;
          }
          if (bVar2 == 0x5f) goto LAB_0048805a;
        }
        this->TokenType = 0x130;
        goto LAB_0048807b;
      default:
        if (bVar2 != 0x42) goto switchD_00483261_caseD_4a;
LAB_004857d0:
        bVar2 = pbVar13[2];
        if ((bVar2 & 0xdf) != 0x59) goto LAB_00485940;
        bVar2 = pbVar13[3];
        if ((bVar2 & 0xdf) != 0x54) goto LAB_00486716;
        bVar2 = pbVar13[4];
        if ((bVar2 & 0xdf) != 0x45) goto LAB_0048719a;
        bVar2 = pbVar13[5];
        pbVar11 = pbVar13 + 5;
        if (bVar2 < 0x5b) {
          bVar15 = 0x2f < bVar2;
          bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00487305:
          if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
        }
        else {
          if (0x5f < bVar2) {
            bVar15 = bVar2 != 0x60;
            bVar14 = bVar2 < 0x7b;
            goto LAB_00487305;
          }
          if (bVar2 == 0x5f) goto LAB_0048805a;
        }
        this->TokenType = 0x139;
        goto LAB_0048807b;
      }
    case 0x54:
    case 0x74:
      pbVar11 = pbVar13 + 1;
      bVar2 = pbVar13[1];
      if (bVar2 < 0x53) {
        if (bVar2 == 0x48) {
LAB_00483953:
          bVar2 = pbVar13[2];
          if ((bVar2 & 0xdf) != 0x52) goto LAB_00485940;
          bVar2 = pbVar13[3];
          if ((bVar2 & 0xdf) != 0x4f) goto LAB_00486716;
          bVar2 = pbVar13[4];
          if ((bVar2 & 0xdf) != 0x57) goto LAB_0048719a;
          bVar2 = pbVar13[5];
          if ((bVar2 & 0xdf) != 0x53) goto LAB_00487277;
          bVar2 = pbVar13[6];
          pbVar11 = pbVar13 + 6;
          if (bVar2 < 0x5b) {
            bVar15 = 0x2f < bVar2;
            bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_0048704b:
            if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
          }
          else {
            if (0x5f < bVar2) {
              bVar15 = bVar2 != 0x60;
              bVar14 = bVar2 < 0x7b;
              goto LAB_0048704b;
            }
            if (bVar2 == 0x5f) goto LAB_0048805a;
          }
          this->TokenType = 0x161;
          goto LAB_0048807b;
        }
        if (bVar2 != 0x52) goto switchD_00483261_caseD_4a;
      }
      else {
        if (bVar2 < 0x69) {
          if (bVar2 != 0x68) goto switchD_00483261_caseD_4a;
          goto LAB_00483953;
        }
        if (bVar2 != 0x72) goto switchD_00483261_caseD_4a;
      }
      pbVar11 = pbVar13 + 2;
      bVar2 = pbVar13[2];
      if (bVar2 < 0x56) {
        if (bVar2 != 0x41) {
          if (bVar2 != 0x55) goto switchD_00483261_caseD_4a;
LAB_00485830:
          bVar2 = pbVar13[3];
          if ((bVar2 & 0xdf) != 0x45) goto LAB_00486716;
          bVar2 = pbVar13[4];
          pbVar11 = pbVar13 + 4;
          if (bVar2 < 0x5b) {
            bVar15 = 0x2f < bVar2;
            bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00486a80:
            if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
          }
          else {
            if (0x5f < bVar2) {
              bVar15 = bVar2 != 0x60;
              bVar14 = bVar2 < 0x7b;
              goto LAB_00486a80;
            }
            if (bVar2 == 0x5f) goto LAB_0048805a;
          }
          this->TokenType = 0x150;
          goto LAB_0048807b;
        }
      }
      else {
        if (0x61 < bVar2) {
          if (bVar2 != 0x75) goto switchD_00483261_caseD_4a;
          goto LAB_00485830;
        }
        if (bVar2 != 0x61) goto switchD_00483261_caseD_4a;
      }
      bVar2 = pbVar13[3];
      if ((bVar2 & 0xdf) != 0x4e) goto LAB_00486716;
      bVar2 = pbVar13[4];
      if ((bVar2 & 0xdf) != 0x53) {
LAB_0048719a:
        pbVar11 = pbVar13 + 4;
        goto switchD_00483261_caseD_4a;
      }
      bVar2 = pbVar13[5];
      if ((bVar2 & 0xdf) != 0x49) {
LAB_00487277:
        pbVar11 = pbVar13 + 5;
        goto switchD_00483261_caseD_4a;
      }
      bVar2 = pbVar13[6];
      if ((bVar2 & 0xdf) != 0x45) {
LAB_004871a3:
        pbVar11 = pbVar13 + 6;
        goto switchD_00483261_caseD_4a;
      }
      bVar2 = pbVar13[7];
      if ((bVar2 & 0xdf) != 0x4e) {
LAB_004871a9:
        pbVar11 = pbVar13 + 7;
        goto switchD_00483261_caseD_4a;
      }
      bVar2 = pbVar13[8];
      if ((bVar2 & 0xdf) != 0x54) {
LAB_004876ee:
        pbVar11 = pbVar13 + 8;
        goto switchD_00483261_caseD_4a;
      }
      bVar2 = pbVar13[9];
      pbVar11 = pbVar13 + 9;
      if (bVar2 < 0x5b) {
        bVar15 = 0x2f < bVar2;
        bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00487c00:
        if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
      }
      else {
        if (0x5f < bVar2) {
          bVar15 = bVar2 != 0x60;
          bVar14 = bVar2 < 0x7b;
          goto LAB_00487c00;
        }
        if (bVar2 == 0x5f) goto LAB_0048805a;
      }
      this->TokenType = 0x15e;
      goto LAB_0048807b;
    case 0x55:
    case 0x75:
      pbVar11 = pbVar13 + 1;
      bVar2 = pbVar13[1];
      if (0x68 < bVar2) {
        if (bVar2 < 0x6e) {
          if (bVar2 == 0x69) goto LAB_004847e0;
          if (bVar2 != 0x6c) goto switchD_00483261_caseD_4a;
LAB_00483e54:
          bVar2 = pbVar13[2];
          if ((bVar2 & 0xdf) != 0x4f) goto LAB_00485940;
          bVar2 = pbVar13[3];
          if ((bVar2 & 0xdf) != 0x4e) goto LAB_00486716;
          bVar2 = pbVar13[4];
          if ((bVar2 & 0xdf) != 0x47) goto LAB_0048719a;
          bVar2 = pbVar13[5];
          pbVar11 = pbVar13 + 5;
          if (bVar2 < 0x5b) {
            bVar15 = 0x2f < bVar2;
            bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00486dd7:
            if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
          }
          else {
            if (0x5f < bVar2) {
              bVar15 = bVar2 != 0x60;
              bVar14 = bVar2 < 0x7b;
              goto LAB_00486dd7;
            }
            if (bVar2 == 0x5f) goto LAB_0048805a;
          }
          this->TokenType = 0x143;
          goto LAB_0048807b;
        }
        if (bVar2 == 0x6e) goto LAB_0048485d;
        if (bVar2 != 0x73) goto switchD_00483261_caseD_4a;
LAB_0048466a:
        bVar2 = pbVar13[2];
        if ((bVar2 & 0xdf) != 0x48) goto LAB_00485940;
        bVar2 = pbVar13[3];
        if ((bVar2 & 0xdf) != 0x4f) goto LAB_00486716;
        bVar2 = pbVar13[4];
        if ((bVar2 & 0xdf) != 0x52) goto LAB_0048719a;
        bVar2 = pbVar13[5];
        if ((bVar2 & 0xdf) != 0x54) goto LAB_00487277;
        bVar2 = pbVar13[6];
        pbVar11 = pbVar13 + 6;
        if (bVar2 < 0x5b) {
          bVar15 = 0x2f < bVar2;
          bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_004872a0:
          if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
        }
        else {
          if (0x5f < bVar2) {
            bVar15 = bVar2 != 0x60;
            bVar14 = bVar2 < 0x7b;
            goto LAB_004872a0;
          }
          if (bVar2 == 0x5f) goto LAB_0048805a;
        }
        this->TokenType = 0x13b;
        goto LAB_0048807b;
      }
      if (0x4d < bVar2) {
        if (bVar2 != 0x4e) {
          if (bVar2 != 0x53) goto switchD_00483261_caseD_4a;
          goto LAB_0048466a;
        }
LAB_0048485d:
        bVar2 = pbVar13[2];
        if ((bVar2 & 0xdf) != 0x54) goto LAB_00485940;
        bVar2 = pbVar13[3];
        if ((bVar2 & 0xdf) != 0x49) goto LAB_00486716;
        bVar2 = pbVar13[4];
        if ((bVar2 & 0xdf) != 0x4c) goto LAB_0048719a;
        bVar2 = pbVar13[5];
        pbVar11 = pbVar13 + 5;
        if (bVar2 < 0x5b) {
          bVar15 = 0x2f < bVar2;
          bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00486da3:
          if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
        }
        else {
          if (0x5f < bVar2) {
            bVar15 = bVar2 != 0x60;
            bVar14 = bVar2 < 0x7b;
            goto LAB_00486da3;
          }
          if (bVar2 == 0x5f) goto LAB_0048805a;
        }
        this->TokenType = 0x131;
        goto LAB_0048807b;
      }
      if (bVar2 != 0x49) {
        if (bVar2 != 0x4c) goto switchD_00483261_caseD_4a;
        goto LAB_00483e54;
      }
LAB_004847e0:
      bVar2 = pbVar13[2];
      if ((bVar2 & 0xdf) != 0x4e) goto LAB_00485940;
      bVar2 = pbVar13[3];
      if ((bVar2 & 0xdf) != 0x54) goto LAB_00486716;
      pbVar11 = pbVar13 + 4;
      bVar2 = pbVar13[4];
      if (0x39 < bVar2) {
        if (bVar2 < 0x5f) {
          if ((byte)(bVar2 + 0xbf) < 0x1a) goto LAB_0048805a;
        }
        else if (bVar2 != 0x60 && bVar2 < 0x7b) goto LAB_0048805a;
LAB_00486977:
        this->TokenType = 0x141;
        goto LAB_0048807b;
      }
      if (0x31 < bVar2) {
        if (bVar2 != 0x38) goto LAB_0048805a;
        bVar2 = pbVar13[5];
        pbVar11 = pbVar13 + 5;
        if (bVar2 < 0x5b) {
          bVar15 = 0x2f < bVar2;
          bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00487514:
          if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
        }
        else {
          if (0x5f < bVar2) {
            bVar15 = bVar2 != 0x60;
            bVar14 = bVar2 < 0x7b;
            goto LAB_00487514;
          }
          if (bVar2 == 0x5f) goto LAB_0048805a;
        }
        this->TokenType = 0x13d;
        goto LAB_0048807b;
      }
      if (bVar2 < 0x30) goto LAB_00486977;
      if (bVar2 != 0x31) goto LAB_0048805a;
      bVar2 = pbVar13[5];
      if (bVar2 != 0x36) goto LAB_00487277;
      bVar2 = pbVar13[6];
      pbVar11 = pbVar13 + 6;
      if (bVar2 < 0x5b) {
        bVar15 = 0x2f < bVar2;
        bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00487b70:
        if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
      }
      else {
        if (0x5f < bVar2) {
          bVar15 = bVar2 != 0x60;
          bVar14 = bVar2 < 0x7b;
          goto LAB_00487b70;
        }
        if (bVar2 == 0x5f) goto LAB_0048805a;
      }
      this->TokenType = 0x13f;
      goto LAB_0048807b;
    case 0x56:
    case 0x76:
      pbVar11 = pbVar13 + 1;
      bVar2 = pbVar13[1];
      if (bVar2 < 0x50) {
        if (bVar2 < 0x46) {
          if (bVar2 != 0x41) {
            if (bVar2 != 0x45) goto switchD_00483261_caseD_4a;
            goto LAB_00483dbb;
          }
LAB_00484c10:
          bVar2 = pbVar13[2];
          if ((bVar2 & 0xdf) != 0x52) goto LAB_00485940;
          bVar2 = pbVar13[3];
          pbVar11 = pbVar13 + 3;
          if (bVar2 < 0x5b) {
            bVar15 = 0x2f < bVar2;
            bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_004866ce:
            if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
          }
          else {
            if (0x5f < bVar2) {
              bVar15 = bVar2 != 0x60;
              bVar14 = bVar2 < 0x7b;
              goto LAB_004866ce;
            }
            if (bVar2 == 0x5f) goto LAB_0048805a;
          }
          this->TokenType = 0x159;
          goto LAB_0048807b;
        }
        if (bVar2 != 0x49) {
          if (bVar2 != 0x4f) goto switchD_00483261_caseD_4a;
          goto LAB_00485261;
        }
LAB_004845cc:
        bVar2 = pbVar13[2];
        if ((bVar2 & 0xdf) != 0x52) goto LAB_00485940;
        bVar2 = pbVar13[3];
        if ((bVar2 & 0xdf) != 0x54) goto LAB_00486716;
        bVar2 = pbVar13[4];
        if ((bVar2 & 0xdf) != 0x55) goto LAB_0048719a;
        bVar2 = pbVar13[5];
        if ((bVar2 & 0xdf) != 0x41) goto LAB_00487277;
        bVar2 = pbVar13[6];
        if ((bVar2 & 0xdf) != 0x4c) goto LAB_004871a3;
        bVar2 = pbVar13[7];
        pbVar11 = pbVar13 + 7;
        if (bVar2 < 0x5b) {
          bVar15 = 0x2f < bVar2;
          bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_004877d9:
          if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
        }
        else {
          if (0x5f < bVar2) {
            bVar15 = bVar2 != 0x60;
            bVar14 = bVar2 < 0x7b;
            goto LAB_004877d9;
          }
          if (bVar2 == 0x5f) goto LAB_0048805a;
        }
        this->TokenType = 0x171;
        goto LAB_0048807b;
      }
      if (bVar2 < 0x66) {
        if (bVar2 == 0x61) goto LAB_00484c10;
        if (bVar2 != 0x65) goto switchD_00483261_caseD_4a;
LAB_00483dbb:
        bVar2 = pbVar13[2];
        if ((bVar2 & 0xdf) != 0x43) goto LAB_00485940;
        bVar2 = pbVar13[3];
        if ((bVar2 & 0xdf) != 0x54) goto LAB_00486716;
        bVar2 = pbVar13[4];
        if ((bVar2 & 0xdf) != 0x4f) goto LAB_0048719a;
        bVar2 = pbVar13[5];
        if ((bVar2 & 0xdf) != 0x52) goto LAB_00487277;
        pbVar11 = pbVar13 + 6;
        bVar2 = pbVar13[6];
        if (bVar2 < 0x32) goto switchD_00483261_caseD_4a;
        if (bVar2 == 0x32) {
          bVar2 = pbVar13[7];
          pbVar11 = pbVar13 + 7;
          if (bVar2 < 0x5b) {
            bVar15 = 0x2f < bVar2;
            bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00487a3f:
            if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
          }
          else {
            if (0x5f < bVar2) {
              bVar15 = bVar2 != 0x60;
              bVar14 = bVar2 < 0x7b;
              goto LAB_00487a3f;
            }
            if (bVar2 == 0x5f) goto LAB_0048805a;
          }
          this->TokenType = 0x17a;
        }
        else {
          if (0x33 < bVar2) goto switchD_00483261_caseD_4a;
          bVar2 = pbVar13[7];
          pbVar11 = pbVar13 + 7;
          if (bVar2 < 0x5b) {
            bVar15 = 0x2f < bVar2;
            bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00487c88:
            if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
          }
          else {
            if (0x5f < bVar2) {
              bVar15 = bVar2 != 0x60;
              bVar14 = bVar2 < 0x7b;
              goto LAB_00487c88;
            }
            if (bVar2 == 0x5f) goto LAB_0048805a;
          }
          this->TokenType = 0x17b;
        }
        goto LAB_0048807b;
      }
      if (bVar2 < 0x6a) {
        if (bVar2 != 0x69) goto switchD_00483261_caseD_4a;
        goto LAB_004845cc;
      }
      if (bVar2 != 0x6f) goto switchD_00483261_caseD_4a;
LAB_00485261:
      pbVar11 = pbVar13 + 2;
      bVar2 = pbVar13[2];
      if (bVar2 < 0x4d) {
        if (bVar2 == 0x49) {
LAB_00485aec:
          bVar2 = pbVar13[3];
          if ((bVar2 & 0xdf) != 0x44) goto LAB_00486716;
          bVar2 = pbVar13[4];
          pbVar11 = pbVar13 + 4;
          if (bVar2 < 0x5b) {
            bVar15 = 0x2f < bVar2;
            bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00486f60:
            if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
          }
          else {
            if (0x5f < bVar2) {
              bVar15 = bVar2 != 0x60;
              bVar14 = bVar2 < 0x7b;
              goto LAB_00486f60;
            }
            if (bVar2 == 0x5f) goto LAB_0048805a;
          }
          this->TokenType = 0x144;
          goto LAB_0048807b;
        }
        if (bVar2 != 0x4c) goto switchD_00483261_caseD_4a;
      }
      else {
        if (bVar2 < 0x6a) {
          if (bVar2 != 0x69) goto switchD_00483261_caseD_4a;
          goto LAB_00485aec;
        }
        if (bVar2 != 0x6c) goto switchD_00483261_caseD_4a;
      }
      bVar2 = pbVar13[3];
      if ((bVar2 & 0xdf) != 0x41) goto LAB_00486716;
      bVar2 = pbVar13[4];
      if ((bVar2 & 0xdf) != 0x54) goto LAB_0048719a;
      bVar2 = pbVar13[5];
      if ((bVar2 & 0xdf) != 0x49) goto LAB_00487277;
      bVar2 = pbVar13[6];
      if ((bVar2 & 0xdf) != 0x4c) goto LAB_004871a3;
      bVar2 = pbVar13[7];
      if ((bVar2 & 0xdf) != 0x45) goto LAB_004871a9;
      bVar2 = pbVar13[8];
      pbVar11 = pbVar13 + 8;
      if (bVar2 < 0x5b) {
        bVar15 = 0x2f < bVar2;
        bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00487c48:
        if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
      }
      else {
        if (0x5f < bVar2) {
          bVar15 = bVar2 != 0x60;
          bVar14 = bVar2 < 0x7b;
          goto LAB_00487c48;
        }
        if (bVar2 == 0x5f) goto LAB_0048805a;
      }
      this->TokenType = 0x15f;
      goto LAB_0048807b;
    case 0x57:
    case 0x77:
      bVar2 = pbVar13[1];
      if ((bVar2 & 0xdf) != 0x48) goto LAB_004833e8;
      bVar2 = pbVar13[2];
      if ((bVar2 & 0xdf) != 0x49) goto LAB_00485940;
      bVar2 = pbVar13[3];
      if ((bVar2 & 0xdf) != 0x4c) goto LAB_00486716;
      bVar2 = pbVar13[4];
      if ((bVar2 & 0xdf) != 0x45) goto LAB_0048719a;
      bVar2 = pbVar13[5];
      pbVar11 = pbVar13 + 5;
      if (bVar2 < 0x5b) {
        bVar15 = 0x2f < bVar2;
        bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00486837:
        if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
      }
      else {
        if (0x5f < bVar2) {
          bVar15 = bVar2 != 0x60;
          bVar14 = bVar2 < 0x7b;
          goto LAB_00486837;
        }
        if (bVar2 == 0x5f) goto LAB_0048805a;
      }
      this->TokenType = 0x132;
      goto LAB_0048807b;
    case 0x5b:
      pbVar13 = pbVar13 + 1;
      this->TokenType = 0x5b;
      goto LAB_004869b2;
    case 0x5d:
      pbVar13 = pbVar13 + 1;
      this->TokenType = 0x5d;
      goto LAB_004869b2;
    case 0x5e:
      if (pbVar13[1] == 0x3d) {
        pbVar13 = pbVar13 + 2;
        this->TokenType = 0x114;
      }
      else {
        pbVar13 = pbVar13 + 1;
        this->TokenType = 0x5e;
      }
      goto LAB_004869b2;
    case 0x7b:
      pbVar13 = pbVar13 + 1;
      this->StateOptions = false;
      this->TokenType = 0x7b;
      goto LAB_004869b2;
    case 0x7c:
      if (pbVar13[1] == 0x3d) {
        pbVar13 = pbVar13 + 2;
        this->TokenType = 0x115;
      }
      else if (pbVar13[1] == 0x7c) {
        pbVar13 = pbVar13 + 2;
        this->TokenType = 0x11c;
      }
      else {
        pbVar13 = pbVar13 + 1;
        this->TokenType = 0x7c;
      }
      goto LAB_004869b2;
    case 0x7d:
      pbVar13 = pbVar13 + 1;
      this->TokenType = 0x7d;
      goto LAB_004869b2;
    case 0x7e:
      pbVar4 = pbVar13 + 1;
      if (pbVar13[1] != 0x3d) goto LAB_00486413;
      uVar10 = 4;
      if (pbVar13[2] != 0x3d) goto LAB_004863f0;
      pbVar13 = pbVar13 + 3;
      this->TokenType = 0x121;
      goto LAB_004869b2;
    }
    iVar8 = 0x101;
    if (!bVar15) {
      iVar8 = iVar3;
    }
    this->TokenType = iVar8;
    goto LAB_0048807b;
  }
  tokens = true;
  lVar9 = 0x28;
LAB_004881eb:
  bVar15 = false;
  goto LAB_0048826e;
  while (*pbVar4 < 0x21) {
LAB_004828e4:
    pbVar4 = pbVar13 + 1;
    pbVar13 = pbVar13 + 1;
    uVar10 = 2;
    if (*pbVar4 == 10) break;
  }
  goto joined_r0x00487ea2;
LAB_00482acd:
  do {
    pbVar4 = pbVar13 + 1;
    pbVar13 = pbVar13 + 1;
    bVar2 = *pbVar4;
    while (bVar2 == 0x5c) {
      while (pbVar4 = pbVar13 + 1, *pbVar4 != 0x22) {
        pbVar13 = pbVar13 + 1;
        if (*pbVar4 != 0x5c) goto LAB_00482acd;
      }
      pbVar4 = pbVar13 + 2;
      pbVar13 = pbVar13 + 2;
      bVar2 = *pbVar4;
    }
  } while (bVar2 != 0x22);
  pbVar13 = pbVar13 + 1;
LAB_00482afe:
  this->TokenType = 0x102;
LAB_00487e9a:
  uVar10 = 0x13;
  goto joined_r0x00487ea2;
  while (pbVar13 = pbVar4, bVar2 < 0x3a) {
LAB_00482e14:
    pbVar4 = pbVar13 + 1;
    bVar2 = pbVar13[1];
    if (bVar2 < 0x2f) {
      if (bVar2 < 0x21) {
LAB_0048791f:
        if (bVar2 == 10) goto LAB_00487934;
        break;
      }
LAB_00482e2c:
      pbVar13 = pbVar4;
      if (bVar2 == 0x22) break;
      goto LAB_00482e14;
    }
    if (0x3b < bVar2) {
LAB_00482e60:
      pbVar13 = pbVar4;
      if (bVar2 == 0x7d) break;
      goto LAB_00482e14;
    }
    if (bVar2 == 0x2f) {
      bVar2 = pbVar13[2];
      pbVar4 = pbVar13 + 2;
      if (bVar2 < 0x2b) {
        if (bVar2 < 0x21) goto LAB_0048791f;
        bVar2 = bVar2 & 0x37;
        goto LAB_00482e2c;
      }
      if (0x39 < bVar2) {
        if (0x3b < bVar2) goto LAB_00482e60;
        break;
      }
      pbVar13 = pbVar4;
      if (bVar2 == 0x2f) break;
      goto LAB_00482e14;
    }
  }
  do {
    pbVar13 = pbVar4 + 1;
    pbVar11 = pbVar4 + 1;
    pbVar4 = pbVar13;
  } while (*pbVar11 != 10);
LAB_00487934:
  uVar10 = 0x15;
  pbVar13 = pbVar4 + 1;
  goto joined_r0x00487ea2;
LAB_00487e49:
  pbVar4 = pbVar13;
  if (bVar2 < 0x30) {
    if (bVar2 < 0x22) {
      if (bVar2 != 0x21) goto LAB_00487e93;
    }
    else {
      if (bVar2 == 0x22) goto LAB_00487e93;
      if (bVar2 == 0x2f) {
        pbVar4 = pbVar13 + 1;
        bVar2 = pbVar13[1];
        if (bVar2 < 0x2f) {
          if (bVar2 < 0x23) {
            if (bVar2 != 0x21) goto LAB_00487f0c;
          }
          else if (bVar2 == 0x2a) goto LAB_00487f0c;
        }
        else if (bVar2 < 0x3c) {
          if (bVar2 == 0x2f || 0x39 < bVar2) goto LAB_00487f0c;
        }
        else if (bVar2 == 0x7d) goto LAB_00487f0c;
      }
    }
  }
  else if (bVar2 < 0x3c) {
    if (0x39 < bVar2) goto LAB_00487e93;
  }
  else if (bVar2 == 0x7d) goto LAB_00487e93;
LAB_00487e3e:
  bVar2 = pbVar4[1];
  pbVar13 = pbVar4 + 1;
  uVar10 = 0;
  goto LAB_00487e49;
LAB_00487f0c:
  if (uVar10 < 4) {
    if (uVar10 < 2) {
      if (uVar10 != 0) goto LAB_00482afe;
LAB_00487e93:
      this->TokenType = 0x107;
    }
    else if (uVar10 == 2) {
LAB_00487f4a:
      this->TokenType = 0x183;
    }
    else {
LAB_00487f62:
      this->StateMode = '\0';
      this->StateOptions = false;
      this->TokenType = 0x14d;
    }
  }
  else if (uVar10 < 6) {
    if (uVar10 == 4) {
LAB_00487f2d:
      this->TokenType = 0x182;
    }
    else {
LAB_00487f56:
      this->TokenType = 0x176;
    }
  }
  else {
LAB_00487f39:
    this->TokenType = 0x184;
  }
  goto LAB_00487e9a;
code_r0x004826a5:
  uVar10 = 0x13;
  if (9 < (byte)(bVar2 - 0x30)) goto LAB_00482484;
  goto LAB_0048269b;
LAB_004826dd:
  pbVar12 = pbVar13;
  bVar2 = pbVar12[-1];
  if (bVar2 < 0x5b) {
    if (0x39 < bVar2) {
      pbVar13 = pbVar12 + -1;
      uVar10 = 0x13;
      pbVar4 = pbVar13;
      if (bVar2 < 0x41) goto LAB_00482484;
      if (bVar2 == 0x46) goto LAB_00482762;
      goto LAB_004827d0;
    }
    if (bVar2 == 0x27) {
      pbVar13 = pbVar12 + -1;
      goto LAB_004827d0;
    }
    pbVar13 = pbVar12 + 1;
    if (bVar2 < 0x30) goto LAB_0048238b;
    goto LAB_004826dd;
  }
  pbVar13 = pbVar12 + -1;
  if (bVar2 < 0x66) {
    uVar10 = 0x13;
    pbVar4 = pbVar13;
    if (bVar2 != 0x5f && bVar2 < 0x61) goto LAB_00482484;
    goto LAB_004827d0;
  }
  if (bVar2 != 0x66) goto joined_r0x00482667;
LAB_00482762:
  bVar2 = *pbVar12;
  pbVar13 = pbVar12;
  if (bVar2 < 0x5b) {
    if (bVar2 < 0x30) goto joined_r0x00482777;
    uVar10 = 0x13;
    pbVar4 = pbVar12;
    if ((byte)(bVar2 - 0x3a) < 7) goto LAB_00482484;
    goto LAB_004827d0;
  }
  if (bVar2 < 0x61) goto joined_r0x004827a2;
joined_r0x00482667:
  uVar10 = 0x13;
  pbVar4 = pbVar13;
  if (3 < (byte)(bVar2 + 0x85)) {
LAB_004827d0:
    do {
      bVar2 = pbVar13[1];
      pbVar13 = pbVar13 + 1;
LAB_004827d7:
      pbVar4 = pbVar13;
      if (0x5a < bVar2) {
        if (bVar2 < 0x61) {
joined_r0x004827a2:
          uVar10 = 0x13;
          pbVar4 = pbVar13;
          if (bVar2 != 0x5f) break;
        }
        else {
          uVar10 = 0x13;
          if (0xfb < (byte)(bVar2 + 0x81)) break;
        }
        goto LAB_004827d0;
      }
      if (bVar2 < 0x30) {
joined_r0x00482777:
        uVar10 = 0x13;
        pbVar4 = pbVar13;
        if (bVar2 != 0x27) break;
        goto LAB_004827d0;
      }
      uVar10 = 0x13;
    } while ((byte)(bVar2 + 0xbf) < 0xf9);
  }
LAB_00482484:
  pbVar13 = pbVar4;
  if (uVar10 == 0x2e4) {
    this->TokenType = 0x2d;
    if ((pbVar1 <= pbVar13) ||
       ((9 < (byte)(*pbVar13 - 0x30) &&
        (((*pbVar13 != 0x2e || (pbVar1 <= pbVar13 + 1)) || ((char)pbVar13[1] < '0'))))))
    goto LAB_0048811c;
    goto LAB_004821f1;
  }
  if (uVar10 < 0x15) goto joined_r0x00487ec8;
  if (uVar10 == 0x15) goto LAB_00487ead;
  if (uVar10 == 0x2bd) goto LAB_004881d5;
  goto LAB_0048809c;
  while (*pbVar4 < 0x21) {
LAB_0048288b:
    pbVar4 = pbVar13 + 1;
    pbVar13 = pbVar13 + 1;
    uVar10 = 2;
    if (*pbVar4 == 10) break;
  }
  goto LAB_004829bf;
  while( true ) {
    bVar2 = pbVar13[2];
    pbVar13 = pbVar13 + 2;
    uVar10 = (uint)bVar2;
    if (0x2e < uVar10) {
      if (0x3c < bVar2) goto joined_r0x00482c71;
      if (bVar2 == 0x2f) goto LAB_0048754f;
      goto joined_r0x00482cb4;
    }
    pbVar4 = pbVar13;
    if (0x21 < bVar2) {
      bVar2 = bVar2 & 0x37;
      goto joined_r0x00482cc8;
    }
    if (bVar2 != 0x21) break;
LAB_00482c31:
    pbVar4 = pbVar13 + 1;
    bVar2 = pbVar13[1];
    if (0x2f < bVar2) {
      pbVar13 = pbVar4;
      if (bVar2 < 0x3d) {
joined_r0x00482cb4:
        if (bVar2 == 0x3b) goto LAB_0048754f;
      }
      else {
        uVar10 = (uint)bVar2;
joined_r0x00482c71:
        if (uVar10 - 0x7b < 3) goto LAB_0048754f;
        if (bVar2 == 0x3d) goto LAB_0048754f;
      }
      goto LAB_00482c31;
    }
    if (bVar2 < 0x21) break;
    if (bVar2 != 0x2f) {
joined_r0x00482cc8:
      pbVar13 = pbVar4;
      if (bVar2 == 0x22) goto LAB_0048754f;
      goto LAB_00482c31;
    }
  }
  while (pbVar13 = pbVar4, bVar2 != 10) {
LAB_0048754f:
    pbVar4 = pbVar13 + 1;
    bVar2 = pbVar13[1];
  }
  pbVar13 = (byte *)((long)pbVar13 + 1);
  uVar10 = 0x15;
LAB_004829bf:
  if (uVar10 < 0x15) goto joined_r0x00487ec8;
  if (uVar10 == 0x15) goto LAB_00487ead;
  if (uVar10 != 0x2d) {
LAB_004881d5:
    pbVar5 = (byte *)this->ScriptEndPtr;
    if (pbVar1 == pbVar5) {
      this->ScriptPtr = (char *)pbVar13;
      this_00 = &this->BigStringBuffer;
      FString::operator=(this_00,(char *)"");
      this->StringLen = 0;
      if (pbVar1 <= pbVar13) goto LAB_00488376;
      goto LAB_004882af;
    }
    goto LAB_004881e2;
  }
  goto LAB_0048809c;
LAB_00487f80:
  pbVar4 = pbVar13;
  if (bVar2 < 0x3b) {
    if (bVar2 < 0x23) {
joined_r0x00487fd4:
      uVar10 = 0x13;
      if (bVar2 != 0x21) goto LAB_004829bf;
    }
    else if (bVar2 == 0x2f) {
      pbVar4 = pbVar13 + 1;
      bVar2 = pbVar13[1];
      uVar10 = 0x13;
      if (bVar2 < 0x30) {
        if (bVar2 < 0x23) goto joined_r0x00487fd4;
        if ((bVar2 == 0x2a) || (bVar2 == 0x2f)) goto LAB_004829bf;
      }
      else if (bVar2 < 0x3d) {
LAB_00487ffc:
        uVar10 = 0x13;
        if (bVar2 == 0x3b) goto LAB_004829bf;
      }
      else {
        if (bVar2 - 0x7b < 3) goto LAB_004829bf;
LAB_0048802d:
        uVar10 = 0x13;
        if (bVar2 == 0x3d) goto LAB_004829bf;
      }
    }
  }
  else if (bVar2 < 0x3e) {
    uVar10 = 0x13;
    if (bVar2 != 0x3c) goto LAB_004829bf;
  }
  else {
    uVar10 = 0x13;
    if ((byte)(bVar2 + 0x85) < 3) goto LAB_004829bf;
  }
LAB_00487f77:
  bVar2 = pbVar4[1];
  pbVar13 = pbVar4 + 1;
  goto LAB_00487f80;
switchD_00483261_caseD_54:
  pbVar11 = pbVar13 + 2;
  bVar2 = pbVar13[2];
  if (0x52 < bVar2) {
    if (bVar2 < 0x6f) {
      if (bVar2 != 0x61) goto switchD_00483261_caseD_4a;
      goto LAB_00485dec;
    }
    if (bVar2 == 0x6f) goto LAB_004866e5;
    if (bVar2 != 0x72) goto switchD_00483261_caseD_4a;
LAB_00486533:
    pbVar11 = pbVar13 + 3;
    bVar2 = pbVar13[3];
    if (bVar2 < 0x56) {
      if (bVar2 == 0x49) {
LAB_00486b24:
        bVar2 = pbVar13[4];
        if ((bVar2 & 0xdf) != 0x4e) goto LAB_0048719a;
        bVar2 = pbVar13[5];
        if ((bVar2 & 0xdf) != 0x47) goto LAB_00487277;
        bVar2 = pbVar13[6];
        pbVar11 = pbVar13 + 6;
        if (bVar2 < 0x5b) {
          bVar15 = 0x2f < bVar2;
          bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00487be0:
          if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
        }
        else {
          if (0x5f < bVar2) {
            bVar15 = bVar2 != 0x60;
            bVar14 = bVar2 < 0x7b;
            goto LAB_00487be0;
          }
          if (bVar2 == 0x5f) goto LAB_0048805a;
        }
        this->TokenType = 0x149;
        goto LAB_0048807b;
      }
      if (bVar2 != 0x55) goto switchD_00483261_caseD_4a;
    }
    else {
      if (bVar2 < 0x6a) {
        if (bVar2 != 0x69) goto switchD_00483261_caseD_4a;
        goto LAB_00486b24;
      }
      if (bVar2 != 0x75) goto switchD_00483261_caseD_4a;
    }
    bVar2 = pbVar13[4];
    if ((bVar2 & 0xdf) != 0x43) goto LAB_0048719a;
    bVar2 = pbVar13[5];
    if ((bVar2 & 0xdf) != 0x54) goto LAB_00487277;
    bVar2 = pbVar13[6];
    pbVar11 = pbVar13 + 6;
    if (bVar2 < 0x5b) {
      bVar15 = 0x2f < bVar2;
      bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00487bc0:
      if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
    }
    else {
      if (0x5f < bVar2) {
        bVar15 = bVar2 != 0x60;
        bVar14 = bVar2 < 0x7b;
        goto LAB_00487bc0;
      }
      if (bVar2 == 0x5f) goto LAB_0048805a;
    }
    this->TokenType = 0x145;
    goto LAB_0048807b;
  }
  if (0x4e < bVar2) {
    if (bVar2 != 0x4f) {
      if (bVar2 != 0x52) goto switchD_00483261_caseD_4a;
      goto LAB_00486533;
    }
LAB_004866e5:
    bVar2 = pbVar13[3];
    if ((bVar2 & 0xdf) != 0x50) goto LAB_00486716;
    bVar2 = pbVar13[4];
    pbVar11 = pbVar13 + 4;
    if (bVar2 < 0x5b) {
      bVar15 = 0x2f < bVar2;
      bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00487419:
      if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
    }
    else {
      if (0x5f < bVar2) {
        bVar15 = bVar2 != 0x60;
        bVar14 = bVar2 < 0x7b;
        goto LAB_00487419;
      }
      if (bVar2 == 0x5f) goto LAB_0048805a;
    }
    this->TokenType = 0x176;
    goto LAB_0048807b;
  }
  if (bVar2 != 0x41) goto switchD_00483261_caseD_4a;
LAB_00485dec:
  bVar2 = pbVar13[3];
  if ((bVar2 & 0xdf) != 0x54) goto LAB_00486716;
  pbVar11 = pbVar13 + 4;
  bVar2 = pbVar13[4];
  if (bVar2 < 0x4a) {
    if (bVar2 == 0x45) {
LAB_00486d22:
      pbVar11 = pbVar13 + 5;
      bVar2 = pbVar13[5];
      if (bVar2 < 0x5b) {
        if (0x40 < bVar2) {
          if (bVar2 != 0x53) goto LAB_0048805a;
LAB_00487837:
          bVar2 = pbVar13[6];
          pbVar13 = pbVar13 + 6;
          if (bVar2 < 0x5b) {
            bVar15 = 0x2f < bVar2;
            bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00487cc8:
            if ((bool)(bVar15 & bVar14)) goto switchD_0048294f_caseD_48;
          }
          else {
            if (0x5f < bVar2) {
              bVar15 = bVar2 != 0x60;
              bVar14 = bVar2 < 0x7b;
              goto LAB_00487cc8;
            }
            if (bVar2 == 0x5f) goto switchD_0048294f_caseD_48;
          }
          this->TokenType = 0x181;
          goto LAB_004869b2;
        }
        if ((byte)(bVar2 - 0x30) < 10) goto LAB_0048805a;
      }
      else if (bVar2 < 0x61) {
        if (bVar2 == 0x5f) goto LAB_0048805a;
      }
      else {
        if (bVar2 == 0x73) goto LAB_00487837;
        if (bVar2 < 0x7b) goto LAB_0048805a;
      }
      this->TokenType = 0x14b;
      goto LAB_0048807b;
    }
    if (bVar2 != 0x49) goto switchD_00483261_caseD_4a;
  }
  else {
    if (bVar2 < 0x66) {
      if (bVar2 != 0x65) goto switchD_00483261_caseD_4a;
      goto LAB_00486d22;
    }
    if (bVar2 != 0x69) goto switchD_00483261_caseD_4a;
  }
  bVar2 = pbVar13[5];
  if ((bVar2 & 0xdf) != 0x43) goto LAB_00487277;
  bVar2 = pbVar13[6];
  pbVar11 = pbVar13 + 6;
  if (bVar2 < 0x5b) {
    bVar15 = 0x2f < bVar2;
    bVar14 = (byte)(bVar2 + 0xbf) < 0xf9;
LAB_00487ab3:
    if ((bool)(bVar15 & bVar14)) goto LAB_0048805a;
  }
  else {
    if (0x5f < bVar2) {
      bVar15 = bVar2 != 0x60;
      bVar14 = bVar2 < 0x7b;
      goto LAB_00487ab3;
    }
    if (bVar2 == 0x5f) goto LAB_0048805a;
  }
  this->TokenType = 0x15d;
  goto LAB_0048807b;
  while( true ) {
    bVar15 = bVar2 == 0x5f;
    if (bVar2 < 0x60) goto LAB_00488058;
    if (bVar2 == 0x60 || 0x7a < bVar2) break;
LAB_0048805a:
    bVar2 = pbVar11[1];
    pbVar11 = pbVar11 + 1;
switchD_00483261_caseD_4a:
    if (bVar2 < 0x5b) {
      bVar15 = 6 < (byte)(bVar2 - 0x3a) && 0x2f < bVar2;
LAB_00488058:
      if (!bVar15) break;
      goto LAB_0048805a;
    }
  }
  this->TokenType = 0x101;
LAB_0048807b:
  uVar10 = 0x13;
  pbVar13 = pbVar11;
  goto joined_r0x00487ea2;
  while( true ) {
    if (0x39 < bVar2) {
      if (bVar2 == 0x45) goto LAB_004834d4;
      goto LAB_0048309e;
    }
    pbVar13 = pbVar4;
    if (bVar2 == 0x2e) goto LAB_00484108;
    if (bVar2 < 0x30) break;
LAB_00482cfb:
    pbVar4 = pbVar4 + 1;
    bVar2 = *pbVar4;
    pbVar11 = pbVar4;
    if (0x4c < bVar2) {
      if (bVar2 < 0x66) {
        if (bVar2 != 0x65) goto joined_r0x00483087;
LAB_004834d4:
        uVar10 = 2;
        goto LAB_00485be4;
      }
      if (0x6c < bVar2) goto joined_r0x00484ef8;
      if (bVar2 == 0x6c) goto LAB_00486c15;
      break;
    }
  }
LAB_00486c33:
  this->TokenType = 0x104;
  pbVar4 = pbVar11;
LAB_00486c3a:
  uVar10 = 0x13;
  pbVar13 = pbVar4;
  goto joined_r0x00487ea2;
joined_r0x00483087:
  pbVar11 = pbVar4;
  if (bVar2 == 0x55) goto LAB_00486c15;
  goto LAB_00486c33;
LAB_004863a8:
  bVar2 = *pbVar4;
  pbVar11 = pbVar4;
  if (bVar2 < 0x55) {
    if (bVar2 < 0x41) {
      if (9 < (byte)(bVar2 - 0x30)) goto LAB_00486c33;
    }
    else if (0x46 < bVar2) goto LAB_0048309e;
LAB_004863eb:
    pbVar4 = pbVar4 + 1;
    goto LAB_004863a8;
  }
  if (bVar2 < 0x6c) {
    if (bVar2 == 0x55) goto LAB_00486c15;
    if (5 < (byte)(bVar2 + 0x9f)) goto LAB_00486c33;
    goto LAB_004863eb;
  }
  if (bVar2 == 0x6c) goto LAB_00486c15;
joined_r0x00484ef8:
  pbVar11 = pbVar4;
  if (bVar2 == 0x75) goto LAB_00486c15;
  goto LAB_00486c33;
LAB_0048309e:
  pbVar11 = pbVar4;
  if (bVar2 == 0x4c) {
LAB_00486c15:
    pbVar11 = pbVar4 + 1;
    bVar2 = pbVar4[1];
    if (bVar2 < 0x56) {
      if ((bVar2 == 0x4c) || (bVar2 == 0x55)) goto LAB_00486c2c;
    }
    else if (bVar2 < 0x6d) {
      if (bVar2 == 0x6c) {
LAB_00486c2c:
        pbVar11 = pbVar4 + 2;
      }
    }
    else if (bVar2 == 0x75) goto LAB_00486c2c;
  }
  goto LAB_00486c33;
  while( true ) {
    if (bVar2 < 0x30) goto LAB_0048641f;
    pbVar13 = pbVar4;
    if (0x39 < bVar2) break;
LAB_00484108:
    pbVar4 = pbVar13 + 1;
    bVar2 = *pbVar4;
    if (0x45 < bVar2) {
      if (bVar2 < 0x65) goto joined_r0x0048413d;
      uVar10 = 5;
      if (bVar2 == 0x65) goto LAB_00485be4;
      if (bVar2 < 0x67) goto LAB_00485c49;
      goto LAB_0048641f;
    }
  }
  uVar10 = 5;
  if (bVar2 == 0x45) {
LAB_00485be4:
    bVar2 = pbVar4[1];
    if (bVar2 < 0x2d) {
      if (bVar2 == 0x2b) {
LAB_00485bf9:
        if (0xf5 < (byte)(pbVar4[2] - 0x3a)) {
          pbVar4 = pbVar4 + 2;
LAB_00485c20:
          pbVar4 = pbVar4 + 1;
          bVar2 = *pbVar4;
          if (bVar2 < 0x46) goto code_r0x00485c27;
          bVar2 = bVar2 & 0xdf;
joined_r0x0048413d:
          if (bVar2 == 0x46) {
LAB_00485c49:
            pbVar4 = pbVar4 + 1;
          }
          goto LAB_0048641f;
        }
      }
    }
    else {
      if (bVar2 == 0x2d) goto LAB_00485bf9;
      if ((byte)(bVar2 - 0x30) < 10) {
        pbVar4 = pbVar4 + 1;
        goto LAB_00485c20;
      }
    }
LAB_004863f0:
    if (uVar10 < 4) {
      if (uVar10 < 2) {
        if (uVar10 == 0) {
LAB_00483ee8:
          ScriptError(this,"Unexpected character: %c (ASCII %d)\n",(ulong)(uint)(int)(char)*pbVar5);
          uVar10 = 2;
          pbVar13 = pbVar4;
          goto joined_r0x00487ea2;
        }
LAB_00486402:
        this->TokenType = 0x2f;
      }
      else {
        pbVar11 = pbVar4;
        if (uVar10 == 2) goto LAB_00486c33;
LAB_00486434:
        this->TokenType = 0x3c;
      }
    }
    else {
      if (uVar10 != 4) goto LAB_0048641f;
LAB_00486413:
      this->TokenType = 0x7e;
    }
  }
  else {
LAB_0048641f:
    this->TokenType = 0x106;
  }
  goto LAB_00486c3a;
code_r0x00485c27:
  if (9 < (byte)(bVar2 - 0x30)) goto LAB_0048641f;
  goto LAB_00485c20;
LAB_00483669:
  if (bVar2 == 10) goto LAB_00484ebd;
  if (bVar2 == 0x27) {
    this->TokenType = 0x103;
    goto LAB_0048807b;
  }
  bVar2 = *pbVar11;
  pbVar11 = pbVar11 + 1;
  goto LAB_00483669;
LAB_00484ebd:
  uVar10 = 0;
  goto LAB_004863f0;
switchD_0048294f_caseD_22:
  do {
    pbVar4 = pbVar13 + 1;
    pbVar13 = pbVar13 + 1;
    bVar2 = *pbVar4;
    while (bVar2 == 0x5c) {
      while (pbVar4 = pbVar13 + 1, *pbVar4 != 0x22) {
        pbVar13 = pbVar13 + 1;
        if (*pbVar4 != 0x5c) goto switchD_0048294f_caseD_22;
      }
      pbVar4 = pbVar13 + 2;
      pbVar13 = pbVar13 + 2;
      bVar2 = *pbVar4;
    }
  } while (bVar2 != 0x22);
  pbVar13 = pbVar13 + 1;
  this->TokenType = 0x102;
LAB_004869b2:
  uVar10 = 0x13;
  goto joined_r0x00487ea2;
  while (bVar2 == 9) {
LAB_00482f4e:
    pbVar13 = pbVar13 + 1;
    bVar2 = *pbVar13;
    if (10 < bVar2) {
      if (bVar2 != 0x20 && 0xd < bVar2) break;
      goto LAB_00482f4e;
    }
  }
  uVar10 = 2;
joined_r0x00487ea2:
  if (uVar10 < 0x15) {
joined_r0x00487ec8:
    if (uVar10 != 2) goto LAB_0048811c;
    goto LAB_004821e1;
  }
  if (uVar10 == 0x15) {
LAB_00487ead:
    if (pbVar13 < pbVar1) {
      this->Line = this->Line + 1;
      this->Crossed = true;
      goto LAB_004821e1;
    }
    pbVar5 = (byte *)this->ScriptEndPtr;
LAB_004881e2:
    this->ScriptPtr = (char *)pbVar5;
  }
  else {
LAB_0048809c:
    iVar3 = this->Line;
    do {
      pbVar5 = pbVar13 + 1;
      iVar8 = 0x2d;
      if (*pbVar13 == 0x2a) {
        if (*pbVar5 == 0x2f) {
          pbVar5 = pbVar13 + 2;
          iVar8 = 2;
          if (pbVar1 <= pbVar5) {
            this->ScriptPtr = this->ScriptEndPtr;
            iVar8 = 0x301;
          }
        }
      }
      else if (*pbVar13 == 10) {
        if (pbVar5 < pbVar1) {
          iVar3 = iVar3 + 1;
          this->Line = iVar3;
          this->Crossed = true;
        }
        else {
          this->ScriptPtr = this->ScriptEndPtr;
          iVar8 = 0x301;
        }
      }
      pbVar13 = pbVar5;
    } while (iVar8 == 0x2d);
    if (iVar8 == 2) goto LAB_004821e1;
  }
  lVar9 = 0xe8;
  goto LAB_004881eb;
LAB_0048811c:
  if (pbVar1 <= pbVar13) {
    pbVar13 = (byte *)this->ScriptEndPtr;
  }
  this->ScriptPtr = (char *)pbVar13;
  uVar10 = (int)pbVar13 - (int)pbVar5;
  this->StringLen = uVar10;
  if ((tokens) && ((this->TokenType & 0xfffffffeU) == 0x102)) {
    iVar3 = uVar10 - 2;
    this->StringLen = iVar3;
    if ((int)uVar10 < 0x82) {
      memcpy(this->StringBuffer,pbVar5 + 1,(long)iVar3);
    }
    else {
      FString::FString(&FStack_38,(char *)(pbVar5 + 1),(long)iVar3);
      FString::operator=(&this->BigStringBuffer,&FStack_38);
      FString::~FString(&FStack_38);
    }
    if ((this->StateMode != '\0') && (this->TokenType == 0x102)) {
      this->TokenType = 0x107;
    }
  }
  else if ((int)uVar10 < 0x80) {
    memcpy(this->StringBuffer,pbVar5,(long)(int)uVar10);
  }
  else {
    FString::FString(&FStack_38,(char *)pbVar5,(ulong)(uVar10 & 0x7fffffff));
    FString::operator=(&this->BigStringBuffer,&FStack_38);
    FString::~FString(&FStack_38);
  }
  if ((tokens) && (this->StateMode != '\0')) {
    BVar7 = '\x02';
    if (this->TokenType == 0x107) {
      BVar7 = this->StateMode + 0xff;
    }
    this->StateMode = BVar7;
  }
  if ((long)this->StringLen < 0x80) {
    this->String = this->StringBuffer;
    this->StringBuffer[this->StringLen] = '\0';
  }
  else {
    pcVar6 = FString::LockBuffer(&this->BigStringBuffer);
    this->String = pcVar6;
  }
  goto LAB_00488267;
LAB_004882af:
  do {
    if (((this->Escape == true) && (*pbVar13 == 0x5c)) && (pbVar13[1] == 0x22)) {
LAB_004882e4:
      pbVar13 = pbVar13 + 1;
    }
    else if (*pbVar13 == 0xd) {
      if (pbVar13[1] == 10) goto LAB_004882e4;
    }
    else if (*pbVar13 == 0x22) break;
    if (*pbVar13 == 10) {
      if (this->CMode == true) {
        if (this->Escape != false) {
          iVar3 = this->StringLen;
          if (((long)iVar3 != 0) && (this->String[(long)iVar3 + -1] == '\\')) {
            this->StringLen = iVar3 + -1;
            goto LAB_00488331;
          }
        }
        ScriptError(this,"Unterminated string constant");
      }
LAB_00488331:
      this->Line = this->Line + 1;
      this->Crossed = true;
    }
    if (this->StringLen == 0x80) {
      FString::AppendCStrPart(this_00,this->StringBuffer,0x80);
      this->StringLen = 0;
    }
    bVar2 = *pbVar13;
    iVar3 = this->StringLen;
    this->StringLen = iVar3 + 1;
    this->StringBuffer[iVar3] = bVar2;
    pbVar13 = pbVar13 + 1;
  } while (pbVar13 < pbVar1);
LAB_00488376:
  iVar3 = this->StringLen;
  if (iVar3 == 0x80 || *(int *)((this->BigStringBuffer).Chars + -0xc) != 0) {
    FString::AppendCStrPart(this_00,this->StringBuffer,(long)iVar3);
    pcVar6 = FString::LockBuffer(this_00);
    this->String = pcVar6;
    this->StringLen = *(int *)((this->BigStringBuffer).Chars + -0xc);
  }
  else {
    this->String = this->StringBuffer;
    this->StringBuffer[iVar3] = '\0';
  }
  this->ScriptPtr = (char *)(pbVar13 + 1);
LAB_00488267:
  bVar15 = true;
  lVar9 = 0xe8;
LAB_0048826e:
  this->StringBuffer[lVar9 + -0x58] = tokens;
  return bVar15;
}

Assistant:

bool FScanner::ScanString (bool tokens)
{
	const char *marker, *tok;
	bool return_val;

	CheckOpen();
	if (AlreadyGot)
	{
		AlreadyGot = false;
		if (!tokens || LastGotToken)
		{
			return true;
		}
		ScriptPtr = LastGotPtr;
		Line = LastGotLine;
	}

	Crossed = false;
	if (ScriptPtr >= ScriptEndPtr)
	{
		End = true;
		return false;
	}

	LastGotPtr = ScriptPtr;
	LastGotLine = Line;

	// In case the generated scanner does not use marker, avoid compiler warnings.
	marker;
#include "sc_man_scanner.h"
	LastGotToken = tokens;
	return return_val;
}